

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [60];
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  byte bVar50;
  uint uVar51;
  ulong uVar52;
  long lVar54;
  uint uVar55;
  ulong uVar56;
  ulong uVar57;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar85 [16];
  ulong uVar58;
  uint uVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar117 [64];
  undefined1 auVar119 [64];
  undefined1 auVar121 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar130 [64];
  float t1;
  float fVar134;
  undefined4 uVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vfloat4 a0_2;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vfloat4 b0;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  vfloat4 a0_3;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  __m128 a_1;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  __m128 a;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar224;
  float fVar225;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar237;
  float fVar238;
  vfloat4 a0_1;
  undefined1 auVar227 [16];
  float fVar239;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar240;
  float fVar246;
  float fVar247;
  vfloat4 a0;
  undefined1 auVar241 [16];
  float fVar248;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  uint local_648;
  RTCFilterFunctionNArguments local_640;
  undefined1 local_610 [16];
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  uint auStack_5e0 [4];
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 uStack_420;
  undefined1 local_400 [64];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar53;
  undefined1 auVar116 [64];
  undefined1 auVar118 [64];
  undefined1 auVar120 [64];
  undefined1 auVar122 [64];
  undefined1 auVar252 [32];
  
  PVar4 = prim[1];
  uVar56 = (ulong)(byte)PVar4;
  fVar146 = *(float *)(prim + uVar56 * 0x19 + 0x12);
  auVar64 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar64 = vinsertps_avx(auVar64,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar65 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar67 = vsubps_avx(auVar64,*(undefined1 (*) [16])(prim + uVar56 * 0x19 + 6));
  fVar145 = fVar146 * auVar67._0_4_;
  fVar125 = fVar146 * auVar65._0_4_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar56 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar64);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar56 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar73);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar56 * 6 + 6);
  auVar97 = vpmovsxbd_avx2(auVar3);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar56 * 0xb + 6);
  auVar107 = vpmovsxbd_avx2(auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar101 = vpmovsxbd_avx2(auVar75);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar108 = vcvtdq2ps_avx(auVar101);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar56 + 6);
  auVar95 = vpmovsxbd_avx2(auVar70);
  auVar95 = vcvtdq2ps_avx(auVar95);
  uVar58 = (ulong)(uint)((int)(uVar56 * 9) * 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar58 + 6);
  auVar98 = vpmovsxbd_avx2(auVar76);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar58 + uVar56 + 6);
  auVar99 = vpmovsxbd_avx2(auVar85);
  auVar99 = vcvtdq2ps_avx(auVar99);
  uVar52 = (ulong)(uint)((int)(uVar56 * 5) << 2);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = *(ulong *)(prim + uVar52 + 6);
  auVar93 = vpmovsxbd_avx2(auVar66);
  auVar100 = vcvtdq2ps_avx(auVar93);
  auVar165._4_4_ = fVar125;
  auVar165._0_4_ = fVar125;
  auVar165._8_4_ = fVar125;
  auVar165._12_4_ = fVar125;
  auVar165._16_4_ = fVar125;
  auVar165._20_4_ = fVar125;
  auVar165._24_4_ = fVar125;
  auVar165._28_4_ = fVar125;
  auVar258._8_4_ = 1;
  auVar258._0_8_ = 0x100000001;
  auVar258._12_4_ = 1;
  auVar258._16_4_ = 1;
  auVar258._20_4_ = 1;
  auVar258._24_4_ = 1;
  auVar258._28_4_ = 1;
  auVar91 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar103 = ZEXT1632(CONCAT412(fVar146 * auVar65._12_4_,
                                CONCAT48(fVar146 * auVar65._8_4_,
                                         CONCAT44(fVar146 * auVar65._4_4_,fVar125))));
  auVar102 = vpermps_avx2(auVar258,auVar103);
  auVar92 = vpermps_avx512vl(auVar91,auVar103);
  fVar125 = auVar92._0_4_;
  fVar215 = auVar92._4_4_;
  auVar103._4_4_ = fVar215 * auVar97._4_4_;
  auVar103._0_4_ = fVar125 * auVar97._0_4_;
  fVar224 = auVar92._8_4_;
  auVar103._8_4_ = fVar224 * auVar97._8_4_;
  fVar225 = auVar92._12_4_;
  auVar103._12_4_ = fVar225 * auVar97._12_4_;
  fVar131 = auVar92._16_4_;
  auVar103._16_4_ = fVar131 * auVar97._16_4_;
  fVar132 = auVar92._20_4_;
  auVar103._20_4_ = fVar132 * auVar97._20_4_;
  fVar133 = auVar92._24_4_;
  auVar103._24_4_ = fVar133 * auVar97._24_4_;
  auVar103._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar95._4_4_ * fVar215;
  auVar101._0_4_ = auVar95._0_4_ * fVar125;
  auVar101._8_4_ = auVar95._8_4_ * fVar224;
  auVar101._12_4_ = auVar95._12_4_ * fVar225;
  auVar101._16_4_ = auVar95._16_4_ * fVar131;
  auVar101._20_4_ = auVar95._20_4_ * fVar132;
  auVar101._24_4_ = auVar95._24_4_ * fVar133;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar100._4_4_ * fVar215;
  auVar93._0_4_ = auVar100._0_4_ * fVar125;
  auVar93._8_4_ = auVar100._8_4_ * fVar224;
  auVar93._12_4_ = auVar100._12_4_ * fVar225;
  auVar93._16_4_ = auVar100._16_4_ * fVar131;
  auVar93._20_4_ = auVar100._20_4_ * fVar132;
  auVar93._24_4_ = auVar100._24_4_ * fVar133;
  auVar93._28_4_ = auVar92._28_4_;
  auVar64 = vfmadd231ps_fma(auVar103,auVar102,auVar94);
  auVar73 = vfmadd231ps_fma(auVar101,auVar102,auVar108);
  auVar3 = vfmadd231ps_fma(auVar93,auVar99,auVar102);
  auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar165,auVar96);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar165,auVar107);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar98,auVar165);
  auVar245._4_4_ = fVar145;
  auVar245._0_4_ = fVar145;
  auVar245._8_4_ = fVar145;
  auVar245._12_4_ = fVar145;
  auVar245._16_4_ = fVar145;
  auVar245._20_4_ = fVar145;
  auVar245._24_4_ = fVar145;
  auVar245._28_4_ = fVar145;
  auVar93 = ZEXT1632(CONCAT412(fVar146 * auVar67._12_4_,
                               CONCAT48(fVar146 * auVar67._8_4_,
                                        CONCAT44(fVar146 * auVar67._4_4_,fVar145))));
  auVar101 = vpermps_avx2(auVar258,auVar93);
  auVar93 = vpermps_avx512vl(auVar91,auVar93);
  fVar146 = auVar93._0_4_;
  fVar125 = auVar93._4_4_;
  auVar102._4_4_ = fVar125 * auVar97._4_4_;
  auVar102._0_4_ = fVar146 * auVar97._0_4_;
  fVar215 = auVar93._8_4_;
  auVar102._8_4_ = fVar215 * auVar97._8_4_;
  fVar224 = auVar93._12_4_;
  auVar102._12_4_ = fVar224 * auVar97._12_4_;
  fVar225 = auVar93._16_4_;
  auVar102._16_4_ = fVar225 * auVar97._16_4_;
  fVar131 = auVar93._20_4_;
  auVar102._20_4_ = fVar131 * auVar97._20_4_;
  fVar132 = auVar93._24_4_;
  auVar102._24_4_ = fVar132 * auVar97._24_4_;
  auVar102._28_4_ = 1;
  auVar91._4_4_ = auVar95._4_4_ * fVar125;
  auVar91._0_4_ = auVar95._0_4_ * fVar146;
  auVar91._8_4_ = auVar95._8_4_ * fVar215;
  auVar91._12_4_ = auVar95._12_4_ * fVar224;
  auVar91._16_4_ = auVar95._16_4_ * fVar225;
  auVar91._20_4_ = auVar95._20_4_ * fVar131;
  auVar91._24_4_ = auVar95._24_4_ * fVar132;
  auVar91._28_4_ = auVar97._28_4_;
  auVar95._4_4_ = auVar100._4_4_ * fVar125;
  auVar95._0_4_ = auVar100._0_4_ * fVar146;
  auVar95._8_4_ = auVar100._8_4_ * fVar215;
  auVar95._12_4_ = auVar100._12_4_ * fVar224;
  auVar95._16_4_ = auVar100._16_4_ * fVar225;
  auVar95._20_4_ = auVar100._20_4_ * fVar131;
  auVar95._24_4_ = auVar100._24_4_ * fVar132;
  auVar95._28_4_ = auVar93._28_4_;
  auVar74 = vfmadd231ps_fma(auVar102,auVar101,auVar94);
  auVar75 = vfmadd231ps_fma(auVar91,auVar101,auVar108);
  auVar70 = vfmadd231ps_fma(auVar95,auVar101,auVar99);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar245,auVar96);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar245,auVar107);
  auVar110._8_4_ = 0x7fffffff;
  auVar110._0_8_ = 0x7fffffff7fffffff;
  auVar110._12_4_ = 0x7fffffff;
  auVar110._16_4_ = 0x7fffffff;
  auVar110._20_4_ = 0x7fffffff;
  auVar110._24_4_ = 0x7fffffff;
  auVar110._28_4_ = 0x7fffffff;
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar245,auVar98);
  auVar96 = vandps_avx(ZEXT1632(auVar64),auVar110);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  uVar58 = vcmpps_avx512vl(auVar96,auVar157,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar92._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar64._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar73),auVar110);
  uVar58 = vcmpps_avx512vl(auVar96,auVar157,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar104._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar73._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar73._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar73._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar73._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar3),auVar110);
  uVar58 = vcmpps_avx512vl(auVar96,auVar157,1);
  bVar62 = (bool)((byte)uVar58 & 1);
  auVar96._0_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._0_4_;
  bVar62 = (bool)((byte)(uVar58 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._4_4_;
  bVar62 = (bool)((byte)(uVar58 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._8_4_;
  bVar62 = (bool)((byte)(uVar58 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar62 * 0x219392ef | (uint)!bVar62 * auVar3._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar58 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar58 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar58 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar58 >> 7) * 0x219392ef;
  auVar94 = vrcp14ps_avx512vl(auVar92);
  auVar111._8_4_ = 0x3f800000;
  auVar111._0_8_ = 0x3f8000003f800000;
  auVar111._12_4_ = 0x3f800000;
  auVar111._16_4_ = 0x3f800000;
  auVar111._20_4_ = 0x3f800000;
  auVar111._24_4_ = 0x3f800000;
  auVar111._28_4_ = 0x3f800000;
  auVar64 = vfnmadd213ps_fma(auVar92,auVar94,auVar111);
  auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar104);
  auVar73 = vfnmadd213ps_fma(auVar104,auVar94,auVar111);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar96);
  auVar3 = vfnmadd213ps_fma(auVar96,auVar94,auVar111);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar94,auVar94);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar74));
  auVar98._4_4_ = auVar64._4_4_ * auVar96._4_4_;
  auVar98._0_4_ = auVar64._0_4_ * auVar96._0_4_;
  auVar98._8_4_ = auVar64._8_4_ * auVar96._8_4_;
  auVar98._12_4_ = auVar64._12_4_ * auVar96._12_4_;
  auVar98._16_4_ = auVar96._16_4_ * 0.0;
  auVar98._20_4_ = auVar96._20_4_ * 0.0;
  auVar98._24_4_ = auVar96._24_4_ * 0.0;
  auVar98._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar74));
  auVar95 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar109._0_4_ = auVar64._0_4_ * auVar96._0_4_;
  auVar109._4_4_ = auVar64._4_4_ * auVar96._4_4_;
  auVar109._8_4_ = auVar64._8_4_ * auVar96._8_4_;
  auVar109._12_4_ = auVar64._12_4_ * auVar96._12_4_;
  auVar109._16_4_ = auVar96._16_4_ * 0.0;
  auVar109._20_4_ = auVar96._20_4_ * 0.0;
  auVar109._24_4_ = auVar96._24_4_ * 0.0;
  auVar109._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar56 * -2 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar75));
  auVar99._4_4_ = auVar73._4_4_ * auVar96._4_4_;
  auVar99._0_4_ = auVar73._0_4_ * auVar96._0_4_;
  auVar99._8_4_ = auVar73._8_4_ * auVar96._8_4_;
  auVar99._12_4_ = auVar73._12_4_ * auVar96._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * 0.0;
  auVar99._20_4_ = auVar96._20_4_ * 0.0;
  auVar99._24_4_ = auVar96._24_4_ * 0.0;
  auVar99._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar75));
  auVar106._0_4_ = auVar73._0_4_ * auVar96._0_4_;
  auVar106._4_4_ = auVar73._4_4_ * auVar96._4_4_;
  auVar106._8_4_ = auVar73._8_4_ * auVar96._8_4_;
  auVar106._12_4_ = auVar73._12_4_ * auVar96._12_4_;
  auVar106._16_4_ = auVar96._16_4_ * 0.0;
  auVar106._20_4_ = auVar96._20_4_ * 0.0;
  auVar106._24_4_ = auVar96._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar52 + uVar56 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar70));
  auVar100._4_4_ = auVar96._4_4_ * auVar3._4_4_;
  auVar100._0_4_ = auVar96._0_4_ * auVar3._0_4_;
  auVar100._8_4_ = auVar96._8_4_ * auVar3._8_4_;
  auVar100._12_4_ = auVar96._12_4_ * auVar3._12_4_;
  auVar100._16_4_ = auVar96._16_4_ * 0.0;
  auVar100._20_4_ = auVar96._20_4_ * 0.0;
  auVar100._24_4_ = auVar96._24_4_ * 0.0;
  auVar100._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar56 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar70));
  auVar105._0_4_ = auVar3._0_4_ * auVar96._0_4_;
  auVar105._4_4_ = auVar3._4_4_ * auVar96._4_4_;
  auVar105._8_4_ = auVar3._8_4_ * auVar96._8_4_;
  auVar105._12_4_ = auVar3._12_4_ * auVar96._12_4_;
  auVar105._16_4_ = auVar96._16_4_ * 0.0;
  auVar105._20_4_ = auVar96._20_4_ * 0.0;
  auVar105._24_4_ = auVar96._24_4_ * 0.0;
  auVar105._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar98,auVar109);
  auVar94 = vpminsd_avx2(auVar99,auVar106);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar100,auVar105);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar97._4_4_ = uVar135;
  auVar97._0_4_ = uVar135;
  auVar97._8_4_ = uVar135;
  auVar97._12_4_ = uVar135;
  auVar97._16_4_ = uVar135;
  auVar97._20_4_ = uVar135;
  auVar97._24_4_ = uVar135;
  auVar97._28_4_ = uVar135;
  auVar94 = vmaxps_avx512vl(auVar94,auVar97);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar98,auVar109);
  auVar94 = vpmaxsd_avx2(auVar99,auVar106);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar100,auVar105);
  uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar107._4_4_ = uVar135;
  auVar107._0_4_ = uVar135;
  auVar107._8_4_ = uVar135;
  auVar107._12_4_ = uVar135;
  auVar107._16_4_ = uVar135;
  auVar107._20_4_ = uVar135;
  auVar107._24_4_ = uVar135;
  auVar107._28_4_ = uVar135;
  auVar94 = vminps_avx512vl(auVar94,auVar107);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar108._8_4_ = 0x3f800003;
  auVar108._0_8_ = 0x3f8000033f800003;
  auVar108._12_4_ = 0x3f800003;
  auVar108._16_4_ = 0x3f800003;
  auVar108._20_4_ = 0x3f800003;
  auVar108._24_4_ = 0x3f800003;
  auVar108._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar108);
  uVar23 = vpcmpgtd_avx512vl(auVar95,_DAT_01fe9900);
  uVar22 = vcmpps_avx512vl(local_3c0,auVar96,2);
  if ((byte)((byte)uVar22 & (byte)uVar23) != 0) {
    uVar58 = (ulong)(byte)((byte)uVar22 & (byte)uVar23);
    auVar130 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_380 = vmovdqa64_avx512f(auVar130);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar130 = ZEXT1664(auVar64);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar259 = ZEXT1664(auVar64);
    auVar64 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar260 = ZEXT1664(auVar64);
    auVar267 = ZEXT464(0x3f800000);
    do {
      lVar54 = 0;
      for (uVar52 = uVar58; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        lVar54 = lVar54 + 1;
      }
      uVar59 = *(uint *)(prim + 2);
      uVar5 = *(uint *)(prim + lVar54 * 4 + 6);
      pGVar7 = (context->scene->geometries).items[uVar59].ptr;
      lVar8 = *(long *)&pGVar7[1].time_range.upper;
      uVar52 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               (ulong)uVar5 *
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar64 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar52);
      lVar54 = uVar52 + 1;
      auVar73 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar54);
      _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar52);
      auVar74 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar54);
      auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      fVar146 = *(float *)(ray + k * 4 + 0xc0);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar66 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar52
                            ),auVar64,auVar65);
      auVar67 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar54
                            ),auVar73,auVar65);
      auVar68 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar7[3].userPtr + uVar52 * *(long *)&pGVar7[3].fnumTimeSegments
                            ),auVar3,auVar65);
      auVar69 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar54
                            ),auVar74,auVar65);
      auVar78 = ZEXT816(0) << 0x40;
      auVar72._0_4_ = auVar73._0_4_ * 0.0;
      auVar72._4_4_ = auVar73._4_4_ * 0.0;
      auVar72._8_4_ = auVar73._8_4_ * 0.0;
      auVar72._12_4_ = auVar73._12_4_ * 0.0;
      auVar76 = vfmadd231ps_fma(auVar72,auVar67,auVar78);
      auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar66,auVar76);
      auVar77._0_4_ = auVar64._0_4_ + auVar70._0_4_;
      auVar77._4_4_ = auVar64._4_4_ + auVar70._4_4_;
      auVar77._8_4_ = auVar64._8_4_ + auVar70._8_4_;
      auVar77._12_4_ = auVar64._12_4_ + auVar70._12_4_;
      auVar79 = auVar130._0_16_;
      auVar70 = vfmadd231ps_avx512vl(auVar76,auVar66,auVar79);
      auVar71 = vfnmadd231ps_avx512vl(auVar70,auVar64,auVar79);
      auVar227._0_4_ = auVar74._0_4_ * 0.0;
      auVar227._4_4_ = auVar74._4_4_ * 0.0;
      auVar227._8_4_ = auVar74._8_4_ * 0.0;
      auVar227._12_4_ = auVar74._12_4_ * 0.0;
      auVar76 = vfmadd231ps_fma(auVar227,auVar69,auVar78);
      auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar68,auVar76);
      auVar241._0_4_ = auVar3._0_4_ + auVar70._0_4_;
      auVar241._4_4_ = auVar3._4_4_ + auVar70._4_4_;
      auVar241._8_4_ = auVar3._8_4_ + auVar70._8_4_;
      auVar241._12_4_ = auVar3._12_4_ + auVar70._12_4_;
      auVar70 = vfmadd231ps_avx512vl(auVar76,auVar68,auVar79);
      auVar72 = vfnmadd231ps_avx512vl(auVar70,auVar3,auVar79);
      auVar70 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar67,auVar73);
      auVar70 = vfmadd231ps_fma(auVar70,auVar66,auVar78);
      auVar85 = vfmadd231ps_fma(auVar70,auVar64,auVar78);
      auVar73 = vmulps_avx512vl(auVar73,auVar79);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar79,auVar67);
      auVar73 = vfmadd231ps_fma(auVar73,auVar78,auVar66);
      auVar66 = vfnmadd231ps_fma(auVar73,auVar78,auVar64);
      auVar64 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar69,auVar74);
      auVar64 = vfmadd231ps_fma(auVar64,auVar68,auVar78);
      auVar70 = vfmadd231ps_fma(auVar64,auVar3,auVar78);
      auVar64 = vmulps_avx512vl(auVar74,auVar79);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar79,auVar69);
      auVar64 = vfmadd231ps_fma(auVar64,auVar78,auVar68);
      auVar76 = vfnmadd231ps_fma(auVar64,auVar78,auVar3);
      auVar64 = vshufps_avx(auVar71,auVar71,0xc9);
      auVar73 = vshufps_avx(auVar241,auVar241,0xc9);
      fVar134 = auVar71._0_4_;
      auVar81._0_4_ = fVar134 * auVar73._0_4_;
      fVar137 = auVar71._4_4_;
      auVar81._4_4_ = fVar137 * auVar73._4_4_;
      fVar138 = auVar71._8_4_;
      auVar81._8_4_ = fVar138 * auVar73._8_4_;
      fVar139 = auVar71._12_4_;
      auVar81._12_4_ = fVar139 * auVar73._12_4_;
      auVar73 = vfmsub231ps_fma(auVar81,auVar64,auVar241);
      auVar3 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar73 = vshufps_avx(auVar72,auVar72,0xc9);
      auVar195._0_4_ = auVar73._0_4_ * fVar134;
      auVar195._4_4_ = auVar73._4_4_ * fVar137;
      auVar195._8_4_ = auVar73._8_4_ * fVar138;
      auVar195._12_4_ = auVar73._12_4_ * fVar139;
      auVar64 = vfmsub231ps_fma(auVar195,auVar64,auVar72);
      auVar74 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vshufps_avx(auVar66,auVar66,0xc9);
      auVar73 = vshufps_avx(auVar70,auVar70,0xc9);
      fVar125 = auVar66._0_4_;
      auVar206._0_4_ = auVar73._0_4_ * fVar125;
      fVar215 = auVar66._4_4_;
      auVar206._4_4_ = auVar73._4_4_ * fVar215;
      fVar224 = auVar66._8_4_;
      auVar206._8_4_ = auVar73._8_4_ * fVar224;
      fVar225 = auVar66._12_4_;
      auVar206._12_4_ = auVar73._12_4_ * fVar225;
      auVar73 = vfmsub231ps_fma(auVar206,auVar64,auVar70);
      auVar70 = vshufps_avx(auVar73,auVar73,0xc9);
      auVar73 = vshufps_avx(auVar76,auVar76,0xc9);
      auVar207._0_4_ = auVar73._0_4_ * fVar125;
      auVar207._4_4_ = auVar73._4_4_ * fVar215;
      auVar207._8_4_ = auVar73._8_4_ * fVar224;
      auVar207._12_4_ = auVar73._12_4_ * fVar225;
      auVar64 = vfmsub231ps_fma(auVar207,auVar64,auVar76);
      auVar76 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar64 = vdpps_avx(auVar3,auVar3,0x7f);
      fVar131 = auVar64._0_4_;
      auVar208._4_12_ = ZEXT812(0) << 0x20;
      auVar208._0_4_ = fVar131;
      auVar73 = vrsqrt14ss_avx512f(auVar78,auVar208);
      auVar67 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
      auVar68 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
      fVar132 = auVar73._0_4_;
      fVar133 = auVar67._0_4_ - auVar68._0_4_ * fVar132 * fVar132 * fVar132;
      auVar73 = vdpps_avx(auVar3,auVar74,0x7f);
      fVar240 = fVar133 * auVar3._0_4_;
      fVar246 = fVar133 * auVar3._4_4_;
      fVar247 = fVar133 * auVar3._8_4_;
      fVar248 = fVar133 * auVar3._12_4_;
      auVar196._0_4_ = fVar131 * auVar74._0_4_;
      auVar196._4_4_ = fVar131 * auVar74._4_4_;
      auVar196._8_4_ = fVar131 * auVar74._8_4_;
      auVar196._12_4_ = fVar131 * auVar74._12_4_;
      fVar131 = auVar73._0_4_;
      auVar82._0_4_ = fVar131 * auVar3._0_4_;
      auVar82._4_4_ = fVar131 * auVar3._4_4_;
      auVar82._8_4_ = fVar131 * auVar3._8_4_;
      auVar82._12_4_ = fVar131 * auVar3._12_4_;
      auVar3 = vsubps_avx(auVar196,auVar82);
      auVar73 = vrcp14ss_avx512f(auVar78,auVar208);
      auVar64 = vfnmadd213ss_avx512f(auVar64,auVar73,ZEXT416(0x40000000));
      fVar131 = auVar73._0_4_ * auVar64._0_4_;
      auVar64 = vdpps_avx(auVar70,auVar70,0x7f);
      fVar132 = auVar64._0_4_;
      auVar197._4_12_ = ZEXT812(0) << 0x20;
      auVar197._0_4_ = fVar132;
      auVar73 = vrsqrt14ss_avx512f(auVar78,auVar197);
      auVar74 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
      auVar67 = vmulss_avx512f(auVar64,ZEXT416(0x3f000000));
      fVar145 = auVar73._0_4_;
      fVar145 = auVar74._0_4_ - auVar67._0_4_ * fVar145 * fVar145 * fVar145;
      auVar73 = vdpps_avx(auVar70,auVar76,0x7f);
      fVar226 = fVar145 * auVar70._0_4_;
      fVar237 = fVar145 * auVar70._4_4_;
      fVar238 = fVar145 * auVar70._8_4_;
      fVar239 = fVar145 * auVar70._12_4_;
      auVar84._0_4_ = fVar132 * auVar76._0_4_;
      auVar84._4_4_ = fVar132 * auVar76._4_4_;
      auVar84._8_4_ = fVar132 * auVar76._8_4_;
      auVar84._12_4_ = fVar132 * auVar76._12_4_;
      fVar132 = auVar73._0_4_;
      auVar83._0_4_ = fVar132 * auVar70._0_4_;
      auVar83._4_4_ = fVar132 * auVar70._4_4_;
      auVar83._8_4_ = fVar132 * auVar70._8_4_;
      auVar83._12_4_ = fVar132 * auVar70._12_4_;
      auVar74 = vsubps_avx(auVar84,auVar83);
      auVar73 = vrcp14ss_avx512f(auVar78,auVar197);
      auVar64 = vfnmadd213ss_avx512f(auVar64,auVar73,ZEXT416(0x40000000));
      fVar132 = auVar64._0_4_ * auVar73._0_4_;
      auVar64 = vshufps_avx(auVar77,auVar77,0xff);
      auVar182._0_4_ = fVar240 * auVar64._0_4_;
      auVar182._4_4_ = fVar246 * auVar64._4_4_;
      auVar182._8_4_ = fVar247 * auVar64._8_4_;
      auVar182._12_4_ = fVar248 * auVar64._12_4_;
      local_520 = vsubps_avx(auVar77,auVar182);
      auVar73 = vshufps_avx(auVar71,auVar71,0xff);
      auVar90._0_4_ = auVar73._0_4_ * fVar240 + auVar64._0_4_ * fVar133 * fVar131 * auVar3._0_4_;
      auVar90._4_4_ = auVar73._4_4_ * fVar246 + auVar64._4_4_ * fVar133 * fVar131 * auVar3._4_4_;
      auVar90._8_4_ = auVar73._8_4_ * fVar247 + auVar64._8_4_ * fVar133 * fVar131 * auVar3._8_4_;
      auVar90._12_4_ = auVar73._12_4_ * fVar248 + auVar64._12_4_ * fVar133 * fVar131 * auVar3._12_4_
      ;
      auVar3 = vsubps_avx(auVar71,auVar90);
      local_530._0_4_ = auVar182._0_4_ + auVar77._0_4_;
      local_530._4_4_ = auVar182._4_4_ + auVar77._4_4_;
      fStack_528 = auVar182._8_4_ + auVar77._8_4_;
      fStack_524 = auVar182._12_4_ + auVar77._12_4_;
      auVar67._0_4_ = fVar134 + auVar90._0_4_;
      auVar67._4_4_ = fVar137 + auVar90._4_4_;
      auVar67._8_4_ = fVar138 + auVar90._8_4_;
      auVar67._12_4_ = fVar139 + auVar90._12_4_;
      auVar64 = vshufps_avx(auVar85,auVar85,0xff);
      auVar86._0_4_ = fVar226 * auVar64._0_4_;
      auVar86._4_4_ = fVar237 * auVar64._4_4_;
      auVar86._8_4_ = fVar238 * auVar64._8_4_;
      auVar86._12_4_ = fVar239 * auVar64._12_4_;
      local_540 = vsubps_avx(auVar85,auVar86);
      auVar73 = vshufps_avx(auVar66,auVar66,0xff);
      auVar69._0_4_ = auVar73._0_4_ * fVar226 + auVar64._0_4_ * fVar145 * auVar74._0_4_ * fVar132;
      auVar69._4_4_ = auVar73._4_4_ * fVar237 + auVar64._4_4_ * fVar145 * auVar74._4_4_ * fVar132;
      auVar69._8_4_ = auVar73._8_4_ * fVar238 + auVar64._8_4_ * fVar145 * auVar74._8_4_ * fVar132;
      auVar69._12_4_ =
           auVar73._12_4_ * fVar239 + auVar64._12_4_ * fVar145 * auVar74._12_4_ * fVar132;
      auVar64 = vsubps_avx(auVar66,auVar69);
      _local_550 = vaddps_avx512vl(auVar85,auVar86);
      auVar78._0_4_ = fVar125 + auVar69._0_4_;
      auVar78._4_4_ = fVar215 + auVar69._4_4_;
      auVar78._8_4_ = fVar224 + auVar69._8_4_;
      auVar78._12_4_ = fVar225 + auVar69._12_4_;
      auVar73 = vmulps_avx512vl(auVar3,auVar65);
      local_560 = vaddps_avx512vl(local_520,auVar73);
      auVar64 = vmulps_avx512vl(auVar64,auVar65);
      local_570 = vsubps_avx512vl(local_540,auVar64);
      auVar64 = vmulps_avx512vl(auVar67,auVar65);
      _local_580 = vaddps_avx512vl(_local_530,auVar64);
      auVar64 = vmulps_avx512vl(auVar78,auVar65);
      _local_590 = vsubps_avx512vl(_local_550,auVar64);
      local_4a0 = vsubps_avx(local_520,auVar75);
      uVar135 = local_4a0._0_4_;
      auVar79._4_4_ = uVar135;
      auVar79._0_4_ = uVar135;
      auVar79._8_4_ = uVar135;
      auVar79._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4a0,local_4a0,0x55);
      auVar73 = vshufps_avx(local_4a0,local_4a0,0xaa);
      aVar1 = pre->ray_space[k].vx.field_0;
      aVar2 = pre->ray_space[k].vy.field_0;
      fVar125 = pre->ray_space[k].vz.field_0.m128[0];
      fVar215 = pre->ray_space[k].vz.field_0.m128[1];
      fVar224 = pre->ray_space[k].vz.field_0.m128[2];
      fVar225 = pre->ray_space[k].vz.field_0.m128[3];
      auVar68._0_4_ = fVar125 * auVar73._0_4_;
      auVar68._4_4_ = fVar215 * auVar73._4_4_;
      auVar68._8_4_ = fVar224 * auVar73._8_4_;
      auVar68._12_4_ = fVar225 * auVar73._12_4_;
      auVar64 = vfmadd231ps_fma(auVar68,(undefined1  [16])aVar2,auVar64);
      auVar70 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar79);
      local_4b0 = vsubps_avx512vl(local_560,auVar75);
      uVar135 = local_4b0._0_4_;
      auVar87._4_4_ = uVar135;
      auVar87._0_4_ = uVar135;
      auVar87._8_4_ = uVar135;
      auVar87._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4b0,local_4b0,0x55);
      auVar73 = vshufps_avx(local_4b0,local_4b0,0xaa);
      auVar80._0_4_ = fVar125 * auVar73._0_4_;
      auVar80._4_4_ = fVar215 * auVar73._4_4_;
      auVar80._8_4_ = fVar224 * auVar73._8_4_;
      auVar80._12_4_ = fVar225 * auVar73._12_4_;
      auVar64 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar2,auVar64);
      auVar76 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar87);
      local_4c0 = vsubps_avx512vl(local_570,auVar75);
      uVar135 = local_4c0._0_4_;
      auVar168._4_4_ = uVar135;
      auVar168._0_4_ = uVar135;
      auVar168._8_4_ = uVar135;
      auVar168._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4c0,local_4c0,0x55);
      auVar73 = vshufps_avx(local_4c0,local_4c0,0xaa);
      auVar88._0_4_ = fVar125 * auVar73._0_4_;
      auVar88._4_4_ = fVar215 * auVar73._4_4_;
      auVar88._8_4_ = fVar224 * auVar73._8_4_;
      auVar88._12_4_ = fVar225 * auVar73._12_4_;
      auVar64 = vfmadd231ps_fma(auVar88,(undefined1  [16])aVar2,auVar64);
      auVar85 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar168);
      local_4d0 = vsubps_avx(local_540,auVar75);
      uVar135 = local_4d0._0_4_;
      auVar183._4_4_ = uVar135;
      auVar183._0_4_ = uVar135;
      auVar183._8_4_ = uVar135;
      auVar183._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4d0,local_4d0,0x55);
      auVar73 = vshufps_avx(local_4d0,local_4d0,0xaa);
      auVar169._0_4_ = fVar125 * auVar73._0_4_;
      auVar169._4_4_ = fVar215 * auVar73._4_4_;
      auVar169._8_4_ = fVar224 * auVar73._8_4_;
      auVar169._12_4_ = fVar225 * auVar73._12_4_;
      auVar64 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar2,auVar64);
      auVar66 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar183);
      local_4e0 = vsubps_avx(_local_530,auVar75);
      uVar135 = local_4e0._0_4_;
      auVar184._4_4_ = uVar135;
      auVar184._0_4_ = uVar135;
      auVar184._8_4_ = uVar135;
      auVar184._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4e0,local_4e0,0x55);
      auVar73 = vshufps_avx(local_4e0,local_4e0,0xaa);
      auVar209._0_4_ = auVar73._0_4_ * fVar125;
      auVar209._4_4_ = auVar73._4_4_ * fVar215;
      auVar209._8_4_ = auVar73._8_4_ * fVar224;
      auVar209._12_4_ = auVar73._12_4_ * fVar225;
      auVar64 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar2,auVar64);
      auVar67 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar184);
      local_4f0 = vsubps_avx512vl(_local_580,auVar75);
      uVar135 = local_4f0._0_4_;
      auVar185._4_4_ = uVar135;
      auVar185._0_4_ = uVar135;
      auVar185._8_4_ = uVar135;
      auVar185._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_4f0,local_4f0,0x55);
      auVar73 = vshufps_avx(local_4f0,local_4f0,0xaa);
      auVar216._0_4_ = auVar73._0_4_ * fVar125;
      auVar216._4_4_ = auVar73._4_4_ * fVar215;
      auVar216._8_4_ = auVar73._8_4_ * fVar224;
      auVar216._12_4_ = auVar73._12_4_ * fVar225;
      auVar64 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar2,auVar64);
      auVar68 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar185);
      local_500 = vsubps_avx512vl(_local_590,auVar75);
      uVar135 = local_500._0_4_;
      auVar186._4_4_ = uVar135;
      auVar186._0_4_ = uVar135;
      auVar186._8_4_ = uVar135;
      auVar186._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_500,local_500,0x55);
      auVar73 = vshufps_avx(local_500,local_500,0xaa);
      auVar228._0_4_ = auVar73._0_4_ * fVar125;
      auVar228._4_4_ = auVar73._4_4_ * fVar215;
      auVar228._8_4_ = auVar73._8_4_ * fVar224;
      auVar228._12_4_ = auVar73._12_4_ * fVar225;
      auVar64 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar2,auVar64);
      auVar69 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar186);
      local_510 = vsubps_avx512vl(_local_550,auVar75);
      uVar135 = local_510._0_4_;
      auVar71._4_4_ = uVar135;
      auVar71._0_4_ = uVar135;
      auVar71._8_4_ = uVar135;
      auVar71._12_4_ = uVar135;
      auVar64 = vshufps_avx(local_510,local_510,0x55);
      auVar73 = vshufps_avx(local_510,local_510,0xaa);
      auVar89._0_4_ = auVar73._0_4_ * fVar125;
      auVar89._4_4_ = auVar73._4_4_ * fVar215;
      auVar89._8_4_ = auVar73._8_4_ * fVar224;
      auVar89._12_4_ = auVar73._12_4_ * fVar225;
      auVar64 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar2,auVar64);
      auVar71 = vfmadd231ps_fma(auVar64,(undefined1  [16])aVar1,auVar71);
      auVar3 = vmovlhps_avx(auVar70,auVar67);
      auVar74 = vmovlhps_avx(auVar76,auVar68);
      local_5f0 = vmovlhps_avx512f(auVar85,auVar69);
      _local_480 = vmovlhps_avx512f(auVar66,auVar71);
      auVar73 = vminps_avx(auVar3,auVar74);
      auVar64 = vmaxps_avx(auVar3,auVar74);
      auVar75 = vminps_avx512vl(local_5f0,_local_480);
      auVar73 = vminps_avx(auVar73,auVar75);
      auVar75 = vmaxps_avx512vl(local_5f0,_local_480);
      auVar64 = vmaxps_avx(auVar64,auVar75);
      auVar75 = vshufpd_avx(auVar73,auVar73,3);
      auVar73 = vminps_avx(auVar73,auVar75);
      auVar75 = vshufpd_avx(auVar64,auVar64,3);
      auVar64 = vmaxps_avx(auVar64,auVar75);
      auVar73 = vandps_avx512vl(auVar73,auVar259._0_16_);
      auVar64 = vandps_avx512vl(auVar64,auVar259._0_16_);
      auVar64 = vmaxps_avx(auVar73,auVar64);
      auVar73 = vmovshdup_avx(auVar64);
      auVar64 = vmaxss_avx(auVar73,auVar64);
      local_648 = (uint)uVar58 + 0xff;
      local_600 = vmovddup_avx512vl(auVar70);
      auVar265 = ZEXT1664(local_600);
      local_610 = vmovddup_avx512vl(auVar76);
      auVar266 = ZEXT1664(local_610);
      auVar75 = vmovddup_avx512vl(auVar85);
      auVar70 = vmovddup_avx512vl(auVar66);
      local_470 = ZEXT416((uint)(auVar64._0_4_ * 9.536743e-07));
      local_440 = vbroadcastss_avx512vl(local_470);
      auVar64 = vxorps_avx512vl(local_440._0_16_,auVar260._0_16_);
      local_460 = vbroadcastss_avx512vl(auVar64);
      uVar52 = 0;
      auVar64 = vsubps_avx(auVar74,auVar3);
      auVar76 = vsubps_avx512vl(local_5f0,auVar74);
      local_490 = vsubps_avx512vl(_local_480,local_5f0);
      local_5a0 = vsubps_avx(_local_530,local_520);
      local_5b0 = vsubps_avx512vl(_local_580,local_560);
      local_5c0 = vsubps_avx512vl(_local_590,local_570);
      _local_5d0 = vsubps_avx512vl(_local_550,local_540);
      auVar130 = vpbroadcastd_avx512f();
      local_300 = vmovdqa64_avx512f(auVar130);
      auVar130 = vpbroadcastd_avx512f();
      local_340 = vmovdqa64_avx512f(auVar130);
      auVar73 = ZEXT816(0x3f80000000000000);
      auVar123._32_32_ = auVar130._32_32_;
      auVar65 = auVar73;
LAB_01d0574c:
      auVar85 = vshufps_avx(auVar65,auVar65,0x50);
      auVar249._8_4_ = 0x3f800000;
      auVar249._0_8_ = 0x3f8000003f800000;
      auVar249._12_4_ = 0x3f800000;
      auVar252._16_4_ = 0x3f800000;
      auVar252._0_16_ = auVar249;
      auVar252._20_4_ = 0x3f800000;
      auVar252._24_4_ = 0x3f800000;
      auVar252._28_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar249,auVar85);
      fVar125 = auVar85._0_4_;
      fVar131 = auVar67._0_4_;
      auVar154._0_4_ = fVar131 * fVar125;
      fVar215 = auVar85._4_4_;
      fVar132 = auVar67._4_4_;
      auVar154._4_4_ = fVar132 * fVar215;
      fVar224 = auVar85._8_4_;
      auVar154._8_4_ = fVar131 * fVar224;
      fVar225 = auVar85._12_4_;
      auVar154._12_4_ = fVar132 * fVar225;
      fVar133 = auVar68._0_4_;
      auVar159._0_4_ = fVar133 * fVar125;
      fVar145 = auVar68._4_4_;
      auVar159._4_4_ = fVar145 * fVar215;
      auVar159._8_4_ = fVar133 * fVar224;
      auVar159._12_4_ = fVar145 * fVar225;
      fVar134 = auVar69._0_4_;
      auVar170._0_4_ = fVar134 * fVar125;
      fVar137 = auVar69._4_4_;
      auVar170._4_4_ = fVar137 * fVar215;
      auVar170._8_4_ = fVar134 * fVar224;
      auVar170._12_4_ = fVar137 * fVar225;
      fVar138 = auVar71._0_4_;
      auVar140._0_4_ = fVar138 * fVar125;
      fVar139 = auVar71._4_4_;
      auVar140._4_4_ = fVar139 * fVar215;
      auVar140._8_4_ = fVar138 * fVar224;
      auVar140._12_4_ = fVar139 * fVar225;
      auVar72 = vfmadd231ps_avx512vl(auVar154,auVar66,auVar265._0_16_);
      auVar77 = vfmadd231ps_avx512vl(auVar159,auVar66,auVar266._0_16_);
      auVar78 = vfmadd231ps_avx512vl(auVar170,auVar66,auVar75);
      auVar66 = vfmadd231ps_avx512vl(auVar140,auVar70,auVar66);
      auVar85 = vmovshdup_avx(auVar73);
      fVar215 = auVar73._0_4_;
      fVar125 = (auVar85._0_4_ - fVar215) * 0.04761905;
      auVar194._4_4_ = fVar215;
      auVar194._0_4_ = fVar215;
      auVar194._8_4_ = fVar215;
      auVar194._12_4_ = fVar215;
      auVar194._16_4_ = fVar215;
      auVar194._20_4_ = fVar215;
      auVar194._24_4_ = fVar215;
      auVar194._28_4_ = fVar215;
      auVar152._0_8_ = auVar85._0_8_;
      auVar152._8_8_ = auVar152._0_8_;
      auVar152._16_8_ = auVar152._0_8_;
      auVar152._24_8_ = auVar152._0_8_;
      auVar96 = vsubps_avx(auVar152,auVar194);
      uVar135 = auVar72._0_4_;
      auVar153._4_4_ = uVar135;
      auVar153._0_4_ = uVar135;
      auVar153._8_4_ = uVar135;
      auVar153._12_4_ = uVar135;
      auVar153._16_4_ = uVar135;
      auVar153._20_4_ = uVar135;
      auVar153._24_4_ = uVar135;
      auVar153._28_4_ = uVar135;
      auVar212._8_4_ = 1;
      auVar212._0_8_ = 0x100000001;
      auVar212._12_4_ = 1;
      auVar212._16_4_ = 1;
      auVar212._20_4_ = 1;
      auVar212._24_4_ = 1;
      auVar212._28_4_ = 1;
      auVar107 = ZEXT1632(auVar72);
      auVar94 = vpermps_avx2(auVar212,auVar107);
      auVar97 = vbroadcastss_avx512vl(auVar77);
      auVar108 = ZEXT1632(auVar77);
      auVar95 = vpermps_avx512vl(auVar212,auVar108);
      auVar98 = vbroadcastss_avx512vl(auVar78);
      auVar105 = ZEXT1632(auVar78);
      auVar99 = vpermps_avx512vl(auVar212,auVar105);
      auVar100 = vbroadcastss_avx512vl(auVar66);
      auVar104 = ZEXT1632(auVar66);
      auVar101 = vpermps_avx512vl(auVar212,auVar104);
      auVar213._4_4_ = fVar125;
      auVar213._0_4_ = fVar125;
      auVar213._8_4_ = fVar125;
      auVar213._12_4_ = fVar125;
      auVar213._16_4_ = fVar125;
      auVar213._20_4_ = fVar125;
      auVar213._24_4_ = fVar125;
      auVar213._28_4_ = fVar125;
      auVar93 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar102 = vpermps_avx512vl(auVar93,auVar107);
      auVar181._8_4_ = 3;
      auVar181._0_8_ = 0x300000003;
      auVar181._12_4_ = 3;
      auVar181._16_4_ = 3;
      auVar181._20_4_ = 3;
      auVar181._24_4_ = 3;
      auVar181._28_4_ = 3;
      auVar103 = vpermps_avx512vl(auVar181,auVar107);
      auVar91 = vpermps_avx512vl(auVar93,auVar108);
      auVar107 = vpermps_avx2(auVar181,auVar108);
      auVar92 = vpermps_avx512vl(auVar93,auVar105);
      auVar108 = vpermps_avx2(auVar181,auVar105);
      auVar93 = vpermps_avx512vl(auVar93,auVar104);
      auVar104 = vpermps_avx512vl(auVar181,auVar104);
      auVar85 = vfmadd132ps_fma(auVar96,auVar194,_DAT_01faff20);
      auVar96 = vsubps_avx(auVar252,ZEXT1632(auVar85));
      auVar105 = vmulps_avx512vl(auVar97,ZEXT1632(auVar85));
      auVar109 = ZEXT1632(auVar85);
      auVar106 = vmulps_avx512vl(auVar95,auVar109);
      auVar66 = vfmadd231ps_fma(auVar105,auVar96,auVar153);
      auVar72 = vfmadd231ps_fma(auVar106,auVar96,auVar94);
      auVar105 = vmulps_avx512vl(auVar98,auVar109);
      auVar106 = vmulps_avx512vl(auVar99,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar97);
      auVar95 = vfmadd231ps_avx512vl(auVar106,auVar96,auVar95);
      auVar105 = vmulps_avx512vl(auVar100,auVar109);
      auVar106 = ZEXT1632(auVar85);
      auVar101 = vmulps_avx512vl(auVar101,auVar106);
      auVar98 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar98);
      auVar99 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar99);
      fVar224 = auVar85._0_4_;
      fVar225 = auVar85._4_4_;
      auVar28._4_4_ = fVar225 * auVar97._4_4_;
      auVar28._0_4_ = fVar224 * auVar97._0_4_;
      fVar226 = auVar85._8_4_;
      auVar28._8_4_ = fVar226 * auVar97._8_4_;
      fVar237 = auVar85._12_4_;
      auVar28._12_4_ = fVar237 * auVar97._12_4_;
      auVar28._16_4_ = auVar97._16_4_ * 0.0;
      auVar28._20_4_ = auVar97._20_4_ * 0.0;
      auVar28._24_4_ = auVar97._24_4_ * 0.0;
      auVar28._28_4_ = fVar215;
      auVar29._4_4_ = fVar225 * auVar95._4_4_;
      auVar29._0_4_ = fVar224 * auVar95._0_4_;
      auVar29._8_4_ = fVar226 * auVar95._8_4_;
      auVar29._12_4_ = fVar237 * auVar95._12_4_;
      auVar29._16_4_ = auVar95._16_4_ * 0.0;
      auVar29._20_4_ = auVar95._20_4_ * 0.0;
      auVar29._24_4_ = auVar95._24_4_ * 0.0;
      auVar29._28_4_ = auVar94._28_4_;
      auVar66 = vfmadd231ps_fma(auVar28,auVar96,ZEXT1632(auVar66));
      auVar72 = vfmadd231ps_fma(auVar29,auVar96,ZEXT1632(auVar72));
      auVar143._0_4_ = fVar224 * auVar98._0_4_;
      auVar143._4_4_ = fVar225 * auVar98._4_4_;
      auVar143._8_4_ = fVar226 * auVar98._8_4_;
      auVar143._12_4_ = fVar237 * auVar98._12_4_;
      auVar143._16_4_ = auVar98._16_4_ * 0.0;
      auVar143._20_4_ = auVar98._20_4_ * 0.0;
      auVar143._24_4_ = auVar98._24_4_ * 0.0;
      auVar143._28_4_ = 0;
      auVar30._4_4_ = fVar225 * auVar99._4_4_;
      auVar30._0_4_ = fVar224 * auVar99._0_4_;
      auVar30._8_4_ = fVar226 * auVar99._8_4_;
      auVar30._12_4_ = fVar237 * auVar99._12_4_;
      auVar30._16_4_ = auVar99._16_4_ * 0.0;
      auVar30._20_4_ = auVar99._20_4_ * 0.0;
      auVar30._24_4_ = auVar99._24_4_ * 0.0;
      auVar30._28_4_ = auVar98._28_4_;
      auVar77 = vfmadd231ps_fma(auVar143,auVar96,auVar97);
      auVar78 = vfmadd231ps_fma(auVar30,auVar96,auVar95);
      auVar31._28_4_ = auVar95._28_4_;
      auVar31._0_28_ =
           ZEXT1628(CONCAT412(fVar237 * auVar78._12_4_,
                              CONCAT48(fVar226 * auVar78._8_4_,
                                       CONCAT44(fVar225 * auVar78._4_4_,fVar224 * auVar78._0_4_))));
      auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar237 * auVar77._12_4_,
                                                   CONCAT48(fVar226 * auVar77._8_4_,
                                                            CONCAT44(fVar225 * auVar77._4_4_,
                                                                     fVar224 * auVar77._0_4_)))),
                                auVar96,ZEXT1632(auVar66));
      auVar80 = vfmadd231ps_fma(auVar31,auVar96,ZEXT1632(auVar72));
      auVar94 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar66));
      auVar97 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar72));
      auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar94 = vmulps_avx512vl(auVar94,auVar95);
      auVar97 = vmulps_avx512vl(auVar97,auVar95);
      auVar205._0_4_ = fVar125 * auVar94._0_4_;
      auVar205._4_4_ = fVar125 * auVar94._4_4_;
      auVar205._8_4_ = fVar125 * auVar94._8_4_;
      auVar205._12_4_ = fVar125 * auVar94._12_4_;
      auVar205._16_4_ = fVar125 * auVar94._16_4_;
      auVar205._20_4_ = fVar125 * auVar94._20_4_;
      auVar205._24_4_ = fVar125 * auVar94._24_4_;
      auVar205._28_4_ = 0;
      auVar94 = vmulps_avx512vl(auVar213,auVar97);
      auVar72 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
      auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_01feed00,ZEXT1632(auVar72));
      auVar98 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01feed00,ZEXT1632(auVar72));
      auVar144._0_4_ = auVar205._0_4_ + auVar79._0_4_;
      auVar144._4_4_ = auVar205._4_4_ + auVar79._4_4_;
      auVar144._8_4_ = auVar205._8_4_ + auVar79._8_4_;
      auVar144._12_4_ = auVar205._12_4_ + auVar79._12_4_;
      auVar144._16_4_ = auVar205._16_4_ + 0.0;
      auVar144._20_4_ = auVar205._20_4_ + 0.0;
      auVar144._24_4_ = auVar205._24_4_ + 0.0;
      auVar144._28_4_ = 0;
      auVar109 = ZEXT1632(auVar72);
      auVar99 = vpermt2ps_avx512vl(auVar205,_DAT_01feed00,auVar109);
      auVar100 = vaddps_avx512vl(ZEXT1632(auVar80),auVar94);
      auVar101 = vpermt2ps_avx512vl(auVar94,_DAT_01feed00,auVar109);
      auVar94 = vsubps_avx(auVar97,auVar99);
      auVar99 = vsubps_avx512vl(auVar98,auVar101);
      auVar101 = vmulps_avx512vl(auVar91,auVar106);
      auVar105 = vmulps_avx512vl(auVar107,auVar106);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar96,auVar102);
      auVar102 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar103);
      auVar103 = vmulps_avx512vl(auVar92,auVar106);
      auVar105 = vmulps_avx512vl(auVar108,auVar106);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar96,auVar91);
      auVar107 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar107);
      auVar93 = vmulps_avx512vl(auVar93,auVar106);
      auVar91 = vmulps_avx512vl(auVar104,auVar106);
      auVar66 = vfmadd231ps_fma(auVar93,auVar96,auVar92);
      auVar93 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar108);
      auVar91 = vmulps_avx512vl(auVar106,auVar103);
      auVar104 = ZEXT1632(auVar85);
      auVar92 = vmulps_avx512vl(auVar104,auVar107);
      auVar101 = vfmadd231ps_avx512vl(auVar91,auVar96,auVar101);
      auVar102 = vfmadd231ps_avx512vl(auVar92,auVar96,auVar102);
      auVar93 = vmulps_avx512vl(auVar104,auVar93);
      auVar103 = vfmadd231ps_avx512vl
                           (ZEXT1632(CONCAT412(fVar237 * auVar66._12_4_,
                                               CONCAT48(fVar226 * auVar66._8_4_,
                                                        CONCAT44(fVar225 * auVar66._4_4_,
                                                                 fVar224 * auVar66._0_4_)))),auVar96
                            ,auVar103);
      auVar107 = vfmadd231ps_avx512vl(auVar93,auVar96,auVar107);
      auVar32._4_4_ = fVar225 * auVar103._4_4_;
      auVar32._0_4_ = fVar224 * auVar103._0_4_;
      auVar32._8_4_ = fVar226 * auVar103._8_4_;
      auVar32._12_4_ = fVar237 * auVar103._12_4_;
      auVar32._16_4_ = auVar103._16_4_ * 0.0;
      auVar32._20_4_ = auVar103._20_4_ * 0.0;
      auVar32._24_4_ = auVar103._24_4_ * 0.0;
      auVar32._28_4_ = auVar108._28_4_;
      auVar108 = vmulps_avx512vl(auVar104,auVar107);
      auVar93 = vfmadd231ps_avx512vl(auVar32,auVar96,auVar101);
      auVar108 = vfmadd231ps_avx512vl(auVar108,auVar102,auVar96);
      auVar96 = vsubps_avx512vl(auVar103,auVar101);
      auVar107 = vsubps_avx512vl(auVar107,auVar102);
      auVar96 = vmulps_avx512vl(auVar96,auVar95);
      auVar107 = vmulps_avx512vl(auVar107,auVar95);
      fVar215 = fVar125 * auVar96._0_4_;
      fVar224 = fVar125 * auVar96._4_4_;
      auVar33._4_4_ = fVar224;
      auVar33._0_4_ = fVar215;
      fVar225 = fVar125 * auVar96._8_4_;
      auVar33._8_4_ = fVar225;
      fVar226 = fVar125 * auVar96._12_4_;
      auVar33._12_4_ = fVar226;
      fVar237 = fVar125 * auVar96._16_4_;
      auVar33._16_4_ = fVar237;
      fVar238 = fVar125 * auVar96._20_4_;
      auVar33._20_4_ = fVar238;
      fVar125 = fVar125 * auVar96._24_4_;
      auVar33._24_4_ = fVar125;
      auVar33._28_4_ = auVar96._28_4_;
      auVar107 = vmulps_avx512vl(auVar213,auVar107);
      auVar95 = vpermt2ps_avx512vl(auVar93,_DAT_01feed00,auVar109);
      auVar101 = vpermt2ps_avx512vl(auVar108,_DAT_01feed00,auVar109);
      auVar214._0_4_ = auVar93._0_4_ + fVar215;
      auVar214._4_4_ = auVar93._4_4_ + fVar224;
      auVar214._8_4_ = auVar93._8_4_ + fVar225;
      auVar214._12_4_ = auVar93._12_4_ + fVar226;
      auVar214._16_4_ = auVar93._16_4_ + fVar237;
      auVar214._20_4_ = auVar93._20_4_ + fVar238;
      auVar214._24_4_ = auVar93._24_4_ + fVar125;
      auVar214._28_4_ = auVar93._28_4_ + auVar96._28_4_;
      auVar96 = vpermt2ps_avx512vl(auVar33,_DAT_01feed00,ZEXT1632(auVar72));
      auVar102 = vaddps_avx512vl(auVar108,auVar107);
      auVar107 = vpermt2ps_avx512vl(auVar107,_DAT_01feed00,ZEXT1632(auVar72));
      auVar96 = vsubps_avx(auVar95,auVar96);
      auVar107 = vsubps_avx512vl(auVar101,auVar107);
      auVar157 = ZEXT1632(auVar79);
      auVar103 = vsubps_avx512vl(auVar93,auVar157);
      auVar165 = ZEXT1632(auVar80);
      auVar91 = vsubps_avx512vl(auVar108,auVar165);
      auVar92 = vsubps_avx512vl(auVar95,auVar97);
      auVar103 = vaddps_avx512vl(auVar103,auVar92);
      auVar92 = vsubps_avx512vl(auVar101,auVar98);
      auVar91 = vaddps_avx512vl(auVar91,auVar92);
      auVar92 = vmulps_avx512vl(auVar165,auVar103);
      auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar157,auVar91);
      auVar104 = vmulps_avx512vl(auVar100,auVar103);
      auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar144,auVar91);
      auVar105 = vmulps_avx512vl(auVar99,auVar103);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar94,auVar91);
      auVar106 = vmulps_avx512vl(auVar98,auVar103);
      auVar106 = vfnmadd231ps_avx512vl(auVar106,auVar97,auVar91);
      auVar109 = vmulps_avx512vl(auVar108,auVar103);
      auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar93,auVar91);
      auVar110 = vmulps_avx512vl(auVar102,auVar103);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar214,auVar91);
      auVar111 = vmulps_avx512vl(auVar107,auVar103);
      auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar96,auVar91);
      auVar103 = vmulps_avx512vl(auVar101,auVar103);
      auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar95,auVar91);
      auVar91 = vminps_avx512vl(auVar92,auVar104);
      auVar92 = vmaxps_avx512vl(auVar92,auVar104);
      auVar104 = vminps_avx512vl(auVar105,auVar106);
      auVar91 = vminps_avx512vl(auVar91,auVar104);
      auVar104 = vmaxps_avx512vl(auVar105,auVar106);
      auVar92 = vmaxps_avx512vl(auVar92,auVar104);
      auVar104 = vminps_avx512vl(auVar109,auVar110);
      auVar105 = vmaxps_avx512vl(auVar109,auVar110);
      auVar106 = vminps_avx512vl(auVar111,auVar103);
      auVar104 = vminps_avx512vl(auVar104,auVar106);
      auVar91 = vminps_avx512vl(auVar91,auVar104);
      auVar103 = vmaxps_avx512vl(auVar111,auVar103);
      auVar103 = vmaxps_avx512vl(auVar105,auVar103);
      auVar103 = vmaxps_avx512vl(auVar92,auVar103);
      uVar22 = vcmpps_avx512vl(auVar91,local_440,2);
      uVar23 = vcmpps_avx512vl(auVar103,local_460,5);
      bVar50 = (byte)uVar22 & (byte)uVar23 & 0x7f;
      if (bVar50 != 0) {
        auVar103 = vsubps_avx512vl(auVar97,auVar157);
        auVar91 = vsubps_avx512vl(auVar98,auVar165);
        auVar92 = vsubps_avx512vl(auVar95,auVar93);
        auVar103 = vaddps_avx512vl(auVar103,auVar92);
        auVar92 = vsubps_avx512vl(auVar101,auVar108);
        auVar91 = vaddps_avx512vl(auVar91,auVar92);
        auVar92 = vmulps_avx512vl(auVar165,auVar103);
        auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar91,auVar157);
        auVar100 = vmulps_avx512vl(auVar100,auVar103);
        auVar100 = vfnmadd213ps_avx512vl(auVar144,auVar91,auVar100);
        auVar99 = vmulps_avx512vl(auVar99,auVar103);
        auVar99 = vfnmadd213ps_avx512vl(auVar94,auVar91,auVar99);
        auVar94 = vmulps_avx512vl(auVar98,auVar103);
        auVar98 = vfnmadd231ps_avx512vl(auVar94,auVar91,auVar97);
        auVar94 = vmulps_avx512vl(auVar108,auVar103);
        auVar108 = vfnmadd231ps_avx512vl(auVar94,auVar91,auVar93);
        auVar94 = vmulps_avx512vl(auVar102,auVar103);
        auVar93 = vfnmadd213ps_avx512vl(auVar214,auVar91,auVar94);
        auVar94 = vmulps_avx512vl(auVar107,auVar103);
        auVar102 = vfnmadd213ps_avx512vl(auVar96,auVar91,auVar94);
        auVar96 = vmulps_avx512vl(auVar101,auVar103);
        auVar95 = vfnmadd231ps_avx512vl(auVar96,auVar95,auVar91);
        auVar94 = vminps_avx(auVar92,auVar100);
        auVar96 = vmaxps_avx(auVar92,auVar100);
        auVar97 = vminps_avx(auVar99,auVar98);
        auVar97 = vminps_avx(auVar94,auVar97);
        auVar94 = vmaxps_avx(auVar99,auVar98);
        auVar96 = vmaxps_avx(auVar96,auVar94);
        auVar107 = vminps_avx(auVar108,auVar93);
        auVar94 = vmaxps_avx(auVar108,auVar93);
        auVar108 = vminps_avx(auVar102,auVar95);
        auVar107 = vminps_avx(auVar107,auVar108);
        auVar107 = vminps_avx(auVar97,auVar107);
        auVar97 = vmaxps_avx(auVar102,auVar95);
        auVar94 = vmaxps_avx(auVar94,auVar97);
        auVar96 = vmaxps_avx(auVar96,auVar94);
        uVar22 = vcmpps_avx512vl(auVar96,local_460,5);
        uVar23 = vcmpps_avx512vl(auVar107,local_440,2);
        bVar50 = bVar50 & (byte)uVar22 & (byte)uVar23;
        if (bVar50 != 0) {
          auStack_5e0[uVar52] = (uint)bVar50;
          uVar22 = vmovlps_avx(auVar73);
          (&uStack_420)[uVar52] = uVar22;
          uVar56 = vmovlps_avx(auVar65);
          auStack_3a0[uVar52] = uVar56;
          uVar52 = (ulong)((int)uVar52 + 1);
        }
      }
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar130 = ZEXT1664(auVar73);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar259 = ZEXT1664(auVar73);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar260 = ZEXT1664(auVar73);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar261 = ZEXT3264(auVar96);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar262 = ZEXT1664(auVar73);
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar263 = ZEXT1664(auVar73);
      auVar112._32_32_ = auVar123._32_32_;
      auVar112._0_32_ = _DAT_01feed20;
      auVar264 = ZEXT3264(_DAT_01feed20);
      auVar113._16_48_ = auVar112._16_48_;
      if ((int)uVar52 != 0) {
        do {
          auVar123._32_32_ = auVar113._32_32_;
          auVar66 = auVar266._0_16_;
          auVar85 = auVar265._0_16_;
          uVar51 = (int)uVar52 - 1;
          uVar53 = (ulong)uVar51;
          uVar6 = auStack_5e0[uVar53];
          auVar65._8_8_ = 0;
          auVar65._0_8_ = auStack_3a0[uVar53];
          uVar56 = 0;
          for (uVar57 = (ulong)uVar6; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000)
          {
            uVar56 = uVar56 + 1;
          }
          uVar55 = uVar6 - 1 & uVar6;
          bVar62 = uVar55 == 0;
          auStack_5e0[uVar53] = uVar55;
          if (bVar62) {
            uVar52 = (ulong)uVar51;
          }
          auVar126._8_8_ = 0;
          auVar126._0_8_ = uVar56;
          auVar73 = vpunpcklqdq_avx(auVar126,ZEXT416((int)uVar56 + 1));
          auVar73 = vcvtqq2ps_avx512vl(auVar73);
          auVar73 = vmulps_avx512vl(auVar73,auVar262._0_16_);
          uVar135 = *(undefined4 *)((long)&uStack_420 + uVar53 * 8 + 4);
          auVar24._4_4_ = uVar135;
          auVar24._0_4_ = uVar135;
          auVar24._8_4_ = uVar135;
          auVar24._12_4_ = uVar135;
          auVar72 = vmulps_avx512vl(auVar73,auVar24);
          auVar77 = auVar263._0_16_;
          auVar73 = vsubps_avx512vl(auVar77,auVar73);
          uVar135 = *(undefined4 *)(&uStack_420 + uVar53);
          auVar25._4_4_ = uVar135;
          auVar25._0_4_ = uVar135;
          auVar25._8_4_ = uVar135;
          auVar25._12_4_ = uVar135;
          auVar73 = vfmadd231ps_avx512vl(auVar72,auVar73,auVar25);
          auVar72 = vmovshdup_avx(auVar73);
          fVar125 = auVar72._0_4_ - auVar73._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar125));
          if (uVar6 == 0 || bVar62) goto LAB_01d0574c;
          auVar72 = vshufps_avx(auVar65,auVar65,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar125));
          auVar78 = vsubps_avx512vl(auVar77,auVar72);
          fVar215 = auVar72._0_4_;
          auVar160._0_4_ = fVar215 * fVar131;
          fVar224 = auVar72._4_4_;
          auVar160._4_4_ = fVar224 * fVar132;
          fVar225 = auVar72._8_4_;
          auVar160._8_4_ = fVar225 * fVar131;
          fVar226 = auVar72._12_4_;
          auVar160._12_4_ = fVar226 * fVar132;
          auVar171._0_4_ = fVar215 * fVar133;
          auVar171._4_4_ = fVar224 * fVar145;
          auVar171._8_4_ = fVar225 * fVar133;
          auVar171._12_4_ = fVar226 * fVar145;
          auVar177._0_4_ = fVar215 * fVar134;
          auVar177._4_4_ = fVar224 * fVar137;
          auVar177._8_4_ = fVar225 * fVar134;
          auVar177._12_4_ = fVar226 * fVar137;
          auVar147._0_4_ = fVar215 * fVar138;
          auVar147._4_4_ = fVar224 * fVar139;
          auVar147._8_4_ = fVar225 * fVar138;
          auVar147._12_4_ = fVar226 * fVar139;
          auVar79 = vfmadd231ps_avx512vl(auVar160,auVar78,auVar85);
          auVar80 = vfmadd231ps_avx512vl(auVar171,auVar78,auVar66);
          auVar72 = vfmadd231ps_fma(auVar177,auVar78,auVar75);
          auVar78 = vfmadd231ps_fma(auVar147,auVar78,auVar70);
          auVar158._16_16_ = auVar79;
          auVar158._0_16_ = auVar79;
          auVar166._16_16_ = auVar80;
          auVar166._0_16_ = auVar80;
          auVar176._16_16_ = auVar72;
          auVar176._0_16_ = auVar72;
          auVar94 = vpermps_avx512vl(auVar264._0_32_,ZEXT1632(auVar73));
          auVar96 = vsubps_avx(auVar166,auVar158);
          auVar79 = vfmadd213ps_fma(auVar96,auVar94,auVar158);
          auVar96 = vsubps_avx(auVar176,auVar166);
          auVar80 = vfmadd213ps_fma(auVar96,auVar94,auVar166);
          auVar72 = vsubps_avx(auVar78,auVar72);
          auVar167._16_16_ = auVar72;
          auVar167._0_16_ = auVar72;
          auVar72 = vfmadd213ps_fma(auVar167,auVar94,auVar176);
          auVar96 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar79));
          auVar78 = vfmadd213ps_fma(auVar96,auVar94,ZEXT1632(auVar79));
          auVar96 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar80));
          auVar72 = vfmadd213ps_fma(auVar96,auVar94,ZEXT1632(auVar80));
          auVar96 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar78));
          auVar169 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar96,auVar94);
          auVar123._0_32_ = vmulps_avx512vl(auVar96,auVar261._0_32_);
          fVar215 = fVar125 * 0.33333334;
          auVar178._0_8_ =
               CONCAT44(auVar169._4_4_ + fVar215 * auVar123._4_4_,
                        auVar169._0_4_ + fVar215 * auVar123._0_4_);
          auVar178._8_4_ = auVar169._8_4_ + fVar215 * auVar123._8_4_;
          auVar178._12_4_ = auVar169._12_4_ + fVar215 * auVar123._12_4_;
          auVar161._0_4_ = fVar215 * auVar123._16_4_;
          auVar161._4_4_ = fVar215 * auVar123._20_4_;
          auVar161._8_4_ = fVar215 * auVar123._24_4_;
          auVar161._12_4_ = fVar215 * auVar123._28_4_;
          auVar90 = vsubps_avx((undefined1  [16])0x0,auVar161);
          auVar87 = vshufpd_avx(auVar169,auVar169,3);
          auVar88 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar72 = vsubps_avx(auVar87,auVar169);
          auVar78 = vsubps_avx(auVar88,(undefined1  [16])0x0);
          auVar198._0_4_ = auVar72._0_4_ + auVar78._0_4_;
          auVar198._4_4_ = auVar72._4_4_ + auVar78._4_4_;
          auVar198._8_4_ = auVar72._8_4_ + auVar78._8_4_;
          auVar198._12_4_ = auVar72._12_4_ + auVar78._12_4_;
          auVar72 = vshufps_avx(auVar169,auVar169,0xb1);
          auVar78 = vshufps_avx(auVar178,auVar178,0xb1);
          auVar79 = vshufps_avx(auVar90,auVar90,0xb1);
          auVar80 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar250._4_4_ = auVar198._0_4_;
          auVar250._0_4_ = auVar198._0_4_;
          auVar250._8_4_ = auVar198._0_4_;
          auVar250._12_4_ = auVar198._0_4_;
          auVar83 = vshufps_avx(auVar198,auVar198,0x55);
          fVar215 = auVar83._0_4_;
          auVar210._0_4_ = auVar72._0_4_ * fVar215;
          fVar224 = auVar83._4_4_;
          auVar210._4_4_ = auVar72._4_4_ * fVar224;
          fVar225 = auVar83._8_4_;
          auVar210._8_4_ = auVar72._8_4_ * fVar225;
          fVar226 = auVar83._12_4_;
          auVar210._12_4_ = auVar72._12_4_ * fVar226;
          auVar217._0_4_ = auVar78._0_4_ * fVar215;
          auVar217._4_4_ = auVar78._4_4_ * fVar224;
          auVar217._8_4_ = auVar78._8_4_ * fVar225;
          auVar217._12_4_ = auVar78._12_4_ * fVar226;
          auVar229._0_4_ = auVar79._0_4_ * fVar215;
          auVar229._4_4_ = auVar79._4_4_ * fVar224;
          auVar229._8_4_ = auVar79._8_4_ * fVar225;
          auVar229._12_4_ = auVar79._12_4_ * fVar226;
          auVar199._0_4_ = auVar80._0_4_ * fVar215;
          auVar199._4_4_ = auVar80._4_4_ * fVar224;
          auVar199._8_4_ = auVar80._8_4_ * fVar225;
          auVar199._12_4_ = auVar80._12_4_ * fVar226;
          auVar72 = vfmadd231ps_fma(auVar210,auVar250,auVar169);
          auVar78 = vfmadd231ps_fma(auVar217,auVar250,auVar178);
          auVar86 = vfmadd231ps_fma(auVar229,auVar250,auVar90);
          auVar168 = vfmadd231ps_fma(auVar199,(undefined1  [16])0x0,auVar250);
          auVar83 = vshufpd_avx(auVar72,auVar72,1);
          auVar84 = vshufpd_avx(auVar78,auVar78,1);
          auVar113._16_48_ = auVar123._16_48_;
          auVar81 = vshufpd_avx512vl(auVar86,auVar86,1);
          auVar82 = vshufpd_avx512vl(auVar168,auVar168,1);
          auVar79 = vminss_avx(auVar72,auVar78);
          auVar72 = vmaxss_avx(auVar78,auVar72);
          auVar80 = vminss_avx(auVar86,auVar168);
          auVar78 = vmaxss_avx(auVar168,auVar86);
          auVar79 = vminss_avx(auVar79,auVar80);
          auVar72 = vmaxss_avx(auVar78,auVar72);
          auVar80 = vminss_avx(auVar83,auVar84);
          auVar78 = vmaxss_avx(auVar84,auVar83);
          auVar83 = vminss_avx512f(auVar81,auVar82);
          auVar84 = vmaxss_avx512f(auVar82,auVar81);
          auVar78 = vmaxss_avx(auVar84,auVar78);
          auVar80 = vminss_avx512f(auVar80,auVar83);
          fVar224 = auVar78._0_4_;
          fVar215 = auVar72._0_4_;
          if (0.0001 <= auVar79._0_4_) {
LAB_01d05e81:
            vucomiss_avx512f(auVar80);
            bVar63 = fVar224 <= -0.0001;
            bVar61 = -0.0001 < fVar215;
            bVar60 = bVar63;
            if (!bVar63) goto LAB_01d05ed7;
            uVar22 = vcmpps_avx512vl(auVar79,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar23 = vcmpps_avx512vl(auVar80,SUB6416(ZEXT464(0x38d1b717),0),5);
            uVar51 = (uint)uVar22 & (uint)uVar23;
            bVar11 = (uVar51 & 1) == 0;
            bVar63 = bVar61 && bVar11;
            bVar60 = bVar61 && (uVar51 & 1) == 0;
            if (bVar61 && bVar11) goto LAB_01d05ed7;
          }
          else {
            bVar63 = fVar224 == -0.0001;
            bVar60 = NAN(fVar224);
            if (fVar224 <= -0.0001) goto LAB_01d05e81;
LAB_01d05ed7:
            auVar84 = vxorps_avx512vl(auVar66,auVar66);
            vcmpss_avx512f(auVar79,auVar84,1);
            uVar22 = vcmpss_avx512f(auVar72,auVar84,1);
            bVar61 = (bool)((byte)uVar22 & 1);
            auVar113._0_16_ = auVar267._0_16_;
            auVar265._4_60_ = auVar113._4_60_;
            auVar265._0_4_ = (float)((uint)bVar61 * -0x40800000 + (uint)!bVar61 * auVar267._0_4_);
            vucomiss_avx512f(auVar265._0_16_);
            bVar60 = (bool)(!bVar63 | bVar60);
            bVar61 = bVar60 == false;
            auVar114._16_48_ = auVar113._16_48_;
            auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar266._4_60_ = auVar114._4_60_;
            auVar266._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * 0x7f800000;
            auVar83 = auVar266._0_16_;
            auVar116._16_48_ = auVar113._16_48_;
            auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar115._4_60_ = auVar116._4_60_;
            auVar115._0_4_ = (uint)bVar60 * auVar84._0_4_ + (uint)!bVar60 * -0x800000;
            auVar66 = auVar115._0_16_;
            auVar85 = vxorps_avx512vl(auVar85,auVar85);
            uVar22 = vcmpss_avx512f(auVar80,auVar84,1);
            bVar63 = (bool)((byte)uVar22 & 1);
            auVar118._16_48_ = auVar113._16_48_;
            auVar118._0_16_ = auVar267._0_16_;
            auVar117._4_60_ = auVar118._4_60_;
            auVar117._0_4_ = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * auVar267._0_4_);
            vucomiss_avx512f(auVar117._0_16_);
            if ((bVar60) || (bVar61)) {
              auVar80 = vucomiss_avx512f(auVar79);
              if ((bVar60) || (bVar61)) {
                auVar84 = vxorps_avx512vl(auVar79,auVar260._0_16_);
                auVar79 = vsubss_avx512f(auVar80,auVar79);
                auVar79 = vdivss_avx512f(auVar84,auVar79);
                auVar80 = vsubss_avx512f(ZEXT416(0x3f800000),auVar79);
                auVar80 = vfmadd213ss_avx512f(auVar80,auVar85,auVar79);
                auVar79 = auVar80;
              }
              else {
                auVar80 = vxorps_avx512vl(auVar80,auVar80);
                vucomiss_avx512f(auVar80);
                if ((bVar60) || (auVar79 = ZEXT416(0x3f800000), bVar61)) {
                  auVar80 = ZEXT416(0x7f800000);
                  auVar79 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar83 = vminss_avx512f(auVar83,auVar80);
              auVar66 = vmaxss_avx(auVar79,auVar66);
            }
            auVar267 = ZEXT464(0x3f800000);
            uVar22 = vcmpss_avx512f(auVar78,auVar85,1);
            bVar63 = (bool)((byte)uVar22 & 1);
            auVar78 = auVar267._0_16_;
            fVar225 = (float)((uint)bVar63 * -0x40800000 + (uint)!bVar63 * 0x3f800000);
            if ((auVar265._0_4_ != fVar225) || (NAN(auVar265._0_4_) || NAN(fVar225))) {
              if ((fVar224 != fVar215) || (NAN(fVar224) || NAN(fVar215))) {
                auVar72 = vxorps_avx512vl(auVar72,auVar260._0_16_);
                auVar200._0_4_ = auVar72._0_4_ / (fVar224 - fVar215);
                auVar200._4_12_ = auVar72._4_12_;
                auVar72 = vsubss_avx512f(auVar78,auVar200);
                auVar72 = vfmadd213ss_avx512f(auVar72,auVar85,auVar200);
                auVar79 = auVar72;
              }
              else if ((fVar215 != 0.0) ||
                      (auVar72 = auVar78, auVar79 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar215))) {
                auVar72 = SUB6416(ZEXT464(0xff800000),0);
                auVar79 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar83 = vminss_avx(auVar83,auVar79);
              auVar66 = vmaxss_avx(auVar72,auVar66);
            }
            bVar63 = auVar117._0_4_ != fVar225;
            auVar72 = vminss_avx512f(auVar83,auVar78);
            auVar120._16_48_ = auVar113._16_48_;
            auVar120._0_16_ = auVar83;
            auVar119._4_60_ = auVar120._4_60_;
            auVar119._0_4_ = (uint)bVar63 * auVar72._0_4_ + (uint)!bVar63 * auVar83._0_4_;
            auVar72 = vmaxss_avx512f(auVar78,auVar66);
            auVar122._16_48_ = auVar113._16_48_;
            auVar122._0_16_ = auVar66;
            auVar121._4_60_ = auVar122._4_60_;
            auVar121._0_4_ = (uint)bVar63 * auVar72._0_4_ + (uint)!bVar63 * auVar66._0_4_;
            auVar66 = vmaxss_avx512f(auVar85,auVar119._0_16_);
            auVar72 = vminss_avx512f(auVar121._0_16_,auVar78);
            if (auVar66._0_4_ <= auVar72._0_4_) {
              auVar84 = vmaxss_avx512f(auVar85,ZEXT416((uint)(auVar66._0_4_ + -0.1)));
              auVar86 = vminss_avx512f(ZEXT416((uint)(auVar72._0_4_ + 0.1)),auVar78);
              auVar148._0_8_ = auVar169._0_8_;
              auVar148._8_8_ = auVar148._0_8_;
              auVar218._8_8_ = auVar178._0_8_;
              auVar218._0_8_ = auVar178._0_8_;
              auVar230._8_8_ = auVar90._0_8_;
              auVar230._0_8_ = auVar90._0_8_;
              auVar66 = vshufpd_avx(auVar178,auVar178,3);
              auVar72 = vshufpd_avx(auVar90,auVar90,3);
              auVar79 = vshufps_avx(auVar84,auVar86,0);
              auVar83 = vsubps_avx512vl(auVar77,auVar79);
              fVar215 = auVar79._0_4_;
              auVar172._0_4_ = fVar215 * auVar87._0_4_;
              fVar224 = auVar79._4_4_;
              auVar172._4_4_ = fVar224 * auVar87._4_4_;
              fVar225 = auVar79._8_4_;
              auVar172._8_4_ = fVar225 * auVar87._8_4_;
              fVar226 = auVar79._12_4_;
              auVar172._12_4_ = fVar226 * auVar87._12_4_;
              auVar179._0_4_ = fVar215 * auVar66._0_4_;
              auVar179._4_4_ = fVar224 * auVar66._4_4_;
              auVar179._8_4_ = fVar225 * auVar66._8_4_;
              auVar179._12_4_ = fVar226 * auVar66._12_4_;
              auVar253._0_4_ = auVar72._0_4_ * fVar215;
              auVar253._4_4_ = auVar72._4_4_ * fVar224;
              auVar253._8_4_ = auVar72._8_4_ * fVar225;
              auVar253._12_4_ = auVar72._12_4_ * fVar226;
              auVar162._0_4_ = fVar215 * auVar88._0_4_;
              auVar162._4_4_ = fVar224 * auVar88._4_4_;
              auVar162._8_4_ = fVar225 * auVar88._8_4_;
              auVar162._12_4_ = fVar226 * auVar88._12_4_;
              auVar80 = vfmadd231ps_fma(auVar172,auVar83,auVar148);
              auVar87 = vfmadd231ps_fma(auVar179,auVar83,auVar218);
              auVar88 = vfmadd231ps_fma(auVar253,auVar83,auVar230);
              auVar83 = vfmadd231ps_fma(auVar162,auVar83,ZEXT816(0));
              auVar72 = vsubss_avx512f(auVar78,auVar84);
              auVar66 = vmovshdup_avx(auVar65);
              auVar168 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar84._0_4_)),auVar65,
                                         auVar72);
              auVar72 = vsubss_avx512f(auVar78,auVar86);
              auVar169 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar86._0_4_)),auVar65,
                                         auVar72);
              auVar84 = vdivss_avx512f(auVar78,ZEXT416((uint)fVar125));
              auVar66 = vsubps_avx(auVar87,auVar80);
              auVar182 = auVar130._0_16_;
              auVar72 = vmulps_avx512vl(auVar66,auVar182);
              auVar66 = vsubps_avx(auVar88,auVar87);
              auVar79 = vmulps_avx512vl(auVar66,auVar182);
              auVar66 = vsubps_avx(auVar83,auVar88);
              auVar66 = vmulps_avx512vl(auVar66,auVar182);
              auVar65 = vminps_avx(auVar79,auVar66);
              auVar66 = vmaxps_avx(auVar79,auVar66);
              auVar65 = vminps_avx(auVar72,auVar65);
              auVar66 = vmaxps_avx(auVar72,auVar66);
              auVar72 = vshufpd_avx(auVar65,auVar65,3);
              auVar79 = vshufpd_avx(auVar66,auVar66,3);
              auVar65 = vminps_avx(auVar65,auVar72);
              auVar66 = vmaxps_avx(auVar66,auVar79);
              fVar125 = auVar84._0_4_;
              auVar201._0_4_ = auVar65._0_4_ * fVar125;
              auVar201._4_4_ = auVar65._4_4_ * fVar125;
              auVar201._8_4_ = auVar65._8_4_ * fVar125;
              auVar201._12_4_ = auVar65._12_4_ * fVar125;
              auVar187._0_4_ = fVar125 * auVar66._0_4_;
              auVar187._4_4_ = fVar125 * auVar66._4_4_;
              auVar187._8_4_ = fVar125 * auVar66._8_4_;
              auVar187._12_4_ = fVar125 * auVar66._12_4_;
              auVar84 = vdivss_avx512f(auVar78,ZEXT416((uint)(auVar169._0_4_ - auVar168._0_4_)));
              auVar66 = vshufpd_avx(auVar80,auVar80,3);
              auVar65 = vshufpd_avx(auVar87,auVar87,3);
              auVar72 = vshufpd_avx(auVar88,auVar88,3);
              auVar79 = vshufpd_avx(auVar83,auVar83,3);
              auVar66 = vsubps_avx(auVar66,auVar80);
              auVar80 = vsubps_avx(auVar65,auVar87);
              auVar87 = vsubps_avx(auVar72,auVar88);
              auVar79 = vsubps_avx(auVar79,auVar83);
              auVar65 = vminps_avx(auVar66,auVar80);
              auVar66 = vmaxps_avx(auVar66,auVar80);
              auVar72 = vminps_avx(auVar87,auVar79);
              auVar72 = vminps_avx(auVar65,auVar72);
              auVar65 = vmaxps_avx(auVar87,auVar79);
              auVar66 = vmaxps_avx(auVar66,auVar65);
              fVar125 = auVar84._0_4_;
              auVar231._0_4_ = fVar125 * auVar72._0_4_;
              auVar231._4_4_ = fVar125 * auVar72._4_4_;
              auVar231._8_4_ = fVar125 * auVar72._8_4_;
              auVar231._12_4_ = fVar125 * auVar72._12_4_;
              auVar219._0_4_ = fVar125 * auVar66._0_4_;
              auVar219._4_4_ = fVar125 * auVar66._4_4_;
              auVar219._8_4_ = fVar125 * auVar66._8_4_;
              auVar219._12_4_ = fVar125 * auVar66._12_4_;
              auVar79 = vinsertps_avx(auVar73,auVar168,0x10);
              auVar81 = vpermt2ps_avx512vl(auVar73,_DAT_01feecd0,auVar169);
              auVar136._0_4_ = auVar79._0_4_ + auVar81._0_4_;
              auVar136._4_4_ = auVar79._4_4_ + auVar81._4_4_;
              auVar136._8_4_ = auVar79._8_4_ + auVar81._8_4_;
              auVar136._12_4_ = auVar79._12_4_ + auVar81._12_4_;
              auVar26._8_4_ = 0x3f000000;
              auVar26._0_8_ = 0x3f0000003f000000;
              auVar26._12_4_ = 0x3f000000;
              auVar84 = vmulps_avx512vl(auVar136,auVar26);
              auVar65 = vshufps_avx(auVar84,auVar84,0x54);
              uVar135 = auVar84._0_4_;
              auVar141._4_4_ = uVar135;
              auVar141._0_4_ = uVar135;
              auVar141._8_4_ = uVar135;
              auVar141._12_4_ = uVar135;
              auVar80 = vfmadd213ps_avx512vl(auVar64,auVar141,auVar3);
              auVar87 = vfmadd213ps_avx512vl(auVar76,auVar141,auVar74);
              auVar72 = vfmadd213ps_fma(local_490,auVar141,local_5f0);
              auVar66 = vsubps_avx(auVar87,auVar80);
              auVar80 = vfmadd213ps_fma(auVar66,auVar141,auVar80);
              auVar66 = vsubps_avx(auVar72,auVar87);
              auVar66 = vfmadd213ps_fma(auVar66,auVar141,auVar87);
              auVar66 = vsubps_avx(auVar66,auVar80);
              auVar72 = vfmadd231ps_fma(auVar80,auVar66,auVar141);
              auVar88 = vmulps_avx512vl(auVar66,auVar182);
              auVar242._8_8_ = auVar72._0_8_;
              auVar242._0_8_ = auVar72._0_8_;
              auVar66 = vshufpd_avx(auVar72,auVar72,3);
              auVar72 = vshufps_avx(auVar84,auVar84,0x55);
              auVar80 = vsubps_avx(auVar66,auVar242);
              auVar87 = vfmadd231ps_fma(auVar242,auVar72,auVar80);
              auVar254._8_8_ = auVar88._0_8_;
              auVar254._0_8_ = auVar88._0_8_;
              auVar66 = vshufpd_avx(auVar88,auVar88,3);
              auVar66 = vsubps_avx512vl(auVar66,auVar254);
              auVar66 = vfmadd213ps_avx512vl(auVar66,auVar72,auVar254);
              auVar142._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
              auVar142._8_4_ = auVar80._8_4_ ^ 0x80000000;
              auVar142._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar72 = vmovshdup_avx512vl(auVar66);
              auVar255._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar255._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar255._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar88 = vmovshdup_avx512vl(auVar80);
              auVar83 = vpermt2ps_avx512vl(auVar255,ZEXT416(5),auVar80);
              auVar72 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar72._0_4_ * auVar80._0_4_)),auVar66,
                                            auVar88);
              auVar80 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar142);
              auVar163._0_4_ = auVar72._0_4_;
              auVar163._4_4_ = auVar163._0_4_;
              auVar163._8_4_ = auVar163._0_4_;
              auVar163._12_4_ = auVar163._0_4_;
              auVar66 = vdivps_avx(auVar83,auVar163);
              auVar82 = vdivps_avx512vl(auVar80,auVar163);
              fVar125 = auVar87._0_4_;
              auVar72 = vshufps_avx(auVar87,auVar87,0x55);
              auVar243._0_4_ = fVar125 * auVar66._0_4_ + auVar72._0_4_ * auVar82._0_4_;
              auVar243._4_4_ = fVar125 * auVar66._4_4_ + auVar72._4_4_ * auVar82._4_4_;
              auVar243._8_4_ = fVar125 * auVar66._8_4_ + auVar72._8_4_ * auVar82._8_4_;
              auVar243._12_4_ = fVar125 * auVar66._12_4_ + auVar72._12_4_ * auVar82._12_4_;
              auVar90 = vsubps_avx(auVar65,auVar243);
              auVar72 = vmovshdup_avx(auVar66);
              auVar65 = vinsertps_avx(auVar201,auVar231,0x1c);
              auVar256._0_4_ = auVar72._0_4_ * auVar65._0_4_;
              auVar256._4_4_ = auVar72._4_4_ * auVar65._4_4_;
              auVar256._8_4_ = auVar72._8_4_ * auVar65._8_4_;
              auVar256._12_4_ = auVar72._12_4_ * auVar65._12_4_;
              auVar86 = vinsertps_avx512f(auVar187,auVar219,0x1c);
              auVar72 = vmulps_avx512vl(auVar72,auVar86);
              auVar83 = vminps_avx512vl(auVar256,auVar72);
              auVar87 = vmaxps_avx(auVar72,auVar256);
              auVar88 = vmovshdup_avx(auVar82);
              auVar72 = vinsertps_avx(auVar231,auVar201,0x4c);
              auVar232._0_4_ = auVar88._0_4_ * auVar72._0_4_;
              auVar232._4_4_ = auVar88._4_4_ * auVar72._4_4_;
              auVar232._8_4_ = auVar88._8_4_ * auVar72._8_4_;
              auVar232._12_4_ = auVar88._12_4_ * auVar72._12_4_;
              auVar80 = vinsertps_avx(auVar219,auVar187,0x4c);
              auVar220._0_4_ = auVar88._0_4_ * auVar80._0_4_;
              auVar220._4_4_ = auVar88._4_4_ * auVar80._4_4_;
              auVar220._8_4_ = auVar88._8_4_ * auVar80._8_4_;
              auVar220._12_4_ = auVar88._12_4_ * auVar80._12_4_;
              auVar88 = vminps_avx(auVar232,auVar220);
              auVar83 = vaddps_avx512vl(auVar83,auVar88);
              auVar88 = vmaxps_avx(auVar220,auVar232);
              auVar221._0_4_ = auVar87._0_4_ + auVar88._0_4_;
              auVar221._4_4_ = auVar87._4_4_ + auVar88._4_4_;
              auVar221._8_4_ = auVar87._8_4_ + auVar88._8_4_;
              auVar221._12_4_ = auVar87._12_4_ + auVar88._12_4_;
              auVar233._8_8_ = 0x3f80000000000000;
              auVar233._0_8_ = 0x3f80000000000000;
              auVar87 = vsubps_avx(auVar233,auVar221);
              auVar88 = vsubps_avx(auVar233,auVar83);
              auVar83 = vsubps_avx(auVar79,auVar84);
              auVar84 = vsubps_avx(auVar81,auVar84);
              fVar226 = auVar83._0_4_;
              auVar257._0_4_ = fVar226 * auVar87._0_4_;
              fVar237 = auVar83._4_4_;
              auVar257._4_4_ = fVar237 * auVar87._4_4_;
              fVar238 = auVar83._8_4_;
              auVar257._8_4_ = fVar238 * auVar87._8_4_;
              fVar239 = auVar83._12_4_;
              auVar257._12_4_ = fVar239 * auVar87._12_4_;
              auVar89 = vbroadcastss_avx512vl(auVar66);
              auVar65 = vmulps_avx512vl(auVar89,auVar65);
              auVar86 = vmulps_avx512vl(auVar89,auVar86);
              auVar89 = vminps_avx512vl(auVar65,auVar86);
              auVar86 = vmaxps_avx512vl(auVar86,auVar65);
              auVar65 = vbroadcastss_avx512vl(auVar82);
              auVar72 = vmulps_avx512vl(auVar65,auVar72);
              auVar65 = vmulps_avx512vl(auVar65,auVar80);
              auVar80 = vminps_avx512vl(auVar72,auVar65);
              auVar80 = vaddps_avx512vl(auVar89,auVar80);
              auVar83 = vmulps_avx512vl(auVar83,auVar88);
              fVar125 = auVar84._0_4_;
              auVar222._0_4_ = fVar125 * auVar87._0_4_;
              fVar215 = auVar84._4_4_;
              auVar222._4_4_ = fVar215 * auVar87._4_4_;
              fVar224 = auVar84._8_4_;
              auVar222._8_4_ = fVar224 * auVar87._8_4_;
              fVar225 = auVar84._12_4_;
              auVar222._12_4_ = fVar225 * auVar87._12_4_;
              auVar234._0_4_ = fVar125 * auVar88._0_4_;
              auVar234._4_4_ = fVar215 * auVar88._4_4_;
              auVar234._8_4_ = fVar224 * auVar88._8_4_;
              auVar234._12_4_ = fVar225 * auVar88._12_4_;
              auVar65 = vmaxps_avx(auVar65,auVar72);
              auVar188._0_4_ = auVar86._0_4_ + auVar65._0_4_;
              auVar188._4_4_ = auVar86._4_4_ + auVar65._4_4_;
              auVar188._8_4_ = auVar86._8_4_ + auVar65._8_4_;
              auVar188._12_4_ = auVar86._12_4_ + auVar65._12_4_;
              auVar202._8_8_ = 0x3f800000;
              auVar202._0_8_ = 0x3f800000;
              auVar65 = vsubps_avx(auVar202,auVar188);
              auVar72 = vsubps_avx512vl(auVar202,auVar80);
              auVar251._0_4_ = fVar226 * auVar65._0_4_;
              auVar251._4_4_ = fVar237 * auVar65._4_4_;
              auVar251._8_4_ = fVar238 * auVar65._8_4_;
              auVar251._12_4_ = fVar239 * auVar65._12_4_;
              auVar244._0_4_ = fVar226 * auVar72._0_4_;
              auVar244._4_4_ = fVar237 * auVar72._4_4_;
              auVar244._8_4_ = fVar238 * auVar72._8_4_;
              auVar244._12_4_ = fVar239 * auVar72._12_4_;
              auVar189._0_4_ = fVar125 * auVar65._0_4_;
              auVar189._4_4_ = fVar215 * auVar65._4_4_;
              auVar189._8_4_ = fVar224 * auVar65._8_4_;
              auVar189._12_4_ = fVar225 * auVar65._12_4_;
              auVar203._0_4_ = fVar125 * auVar72._0_4_;
              auVar203._4_4_ = fVar215 * auVar72._4_4_;
              auVar203._8_4_ = fVar224 * auVar72._8_4_;
              auVar203._12_4_ = fVar225 * auVar72._12_4_;
              auVar65 = vminps_avx(auVar251,auVar244);
              auVar72 = vminps_avx512vl(auVar189,auVar203);
              auVar80 = vminps_avx512vl(auVar65,auVar72);
              auVar65 = vmaxps_avx(auVar244,auVar251);
              auVar72 = vmaxps_avx(auVar203,auVar189);
              auVar72 = vmaxps_avx(auVar72,auVar65);
              auVar87 = vminps_avx512vl(auVar257,auVar83);
              auVar65 = vminps_avx(auVar222,auVar234);
              auVar65 = vminps_avx(auVar87,auVar65);
              auVar65 = vhaddps_avx(auVar80,auVar65);
              auVar87 = vmaxps_avx512vl(auVar83,auVar257);
              auVar80 = vmaxps_avx(auVar234,auVar222);
              auVar80 = vmaxps_avx(auVar80,auVar87);
              auVar72 = vhaddps_avx(auVar72,auVar80);
              auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
              auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
              auVar190._0_4_ = auVar65._0_4_ + auVar90._0_4_;
              auVar190._4_4_ = auVar65._4_4_ + auVar90._4_4_;
              auVar190._8_4_ = auVar65._8_4_ + auVar90._8_4_;
              auVar190._12_4_ = auVar65._12_4_ + auVar90._12_4_;
              auVar204._0_4_ = auVar72._0_4_ + auVar90._0_4_;
              auVar204._4_4_ = auVar72._4_4_ + auVar90._4_4_;
              auVar204._8_4_ = auVar72._8_4_ + auVar90._8_4_;
              auVar204._12_4_ = auVar72._12_4_ + auVar90._12_4_;
              auVar65 = vmaxps_avx(auVar79,auVar190);
              auVar72 = vminps_avx(auVar204,auVar81);
              uVar56 = vcmpps_avx512vl(auVar72,auVar65,1);
              if ((uVar56 & 3) == 0) {
                uVar56 = vcmpps_avx512vl(auVar204,auVar81,1);
                uVar22 = vcmpps_avx512vl(auVar73,auVar190,1);
                if (((ushort)uVar22 & (ushort)uVar56 & 1) == 0) {
                  bVar50 = 0;
                }
                else {
                  auVar65 = vmovshdup_avx(auVar190);
                  bVar50 = auVar168._0_4_ < auVar65._0_4_ & (byte)(uVar56 >> 1) & 0x7f;
                }
                if (((3 < (uint)uVar52 || uVar6 != 0 && !bVar62) | bVar50) != 1) {
                  auVar65 = vinsertps_avx(auVar168,auVar169,0x10);
                  auVar265 = ZEXT1664(local_600);
                  auVar266 = ZEXT1664(local_610);
                  goto LAB_01d0574c;
                }
                lVar54 = 200;
                do {
                  auVar73 = vsubss_avx512f(auVar78,auVar90);
                  fVar224 = auVar73._0_4_;
                  fVar125 = fVar224 * fVar224 * fVar224;
                  auVar73 = vmulss_avx512f(auVar90,ZEXT416(0x40400000));
                  fVar215 = auVar73._0_4_ * fVar224 * fVar224;
                  fVar225 = auVar90._0_4_;
                  auVar72 = ZEXT416(0x40400000);
                  auVar73 = vmulss_avx512f(ZEXT416((uint)(fVar225 * fVar225)),auVar72);
                  fVar224 = fVar224 * auVar73._0_4_;
                  auVar155._4_4_ = fVar125;
                  auVar155._0_4_ = fVar125;
                  auVar155._8_4_ = fVar125;
                  auVar155._12_4_ = fVar125;
                  auVar149._4_4_ = fVar215;
                  auVar149._0_4_ = fVar215;
                  auVar149._8_4_ = fVar215;
                  auVar149._12_4_ = fVar215;
                  auVar127._4_4_ = fVar224;
                  auVar127._0_4_ = fVar224;
                  auVar127._8_4_ = fVar224;
                  auVar127._12_4_ = fVar224;
                  fVar225 = fVar225 * fVar225 * fVar225;
                  auVar173._0_4_ = (float)local_480._0_4_ * fVar225;
                  auVar173._4_4_ = (float)local_480._4_4_ * fVar225;
                  auVar173._8_4_ = fStack_478 * fVar225;
                  auVar173._12_4_ = fStack_474 * fVar225;
                  auVar73 = vfmadd231ps_fma(auVar173,local_5f0,auVar127);
                  auVar73 = vfmadd231ps_fma(auVar73,auVar74,auVar149);
                  auVar73 = vfmadd231ps_fma(auVar73,auVar3,auVar155);
                  auVar128._8_8_ = auVar73._0_8_;
                  auVar128._0_8_ = auVar73._0_8_;
                  auVar73 = vshufpd_avx(auVar73,auVar73,3);
                  auVar65 = vshufps_avx(auVar90,auVar90,0x55);
                  auVar73 = vsubps_avx(auVar73,auVar128);
                  auVar65 = vfmadd213ps_fma(auVar73,auVar65,auVar128);
                  fVar125 = auVar65._0_4_;
                  auVar73 = vshufps_avx(auVar65,auVar65,0x55);
                  auVar129._0_4_ = auVar66._0_4_ * fVar125 + auVar82._0_4_ * auVar73._0_4_;
                  auVar129._4_4_ = auVar66._4_4_ * fVar125 + auVar82._4_4_ * auVar73._4_4_;
                  auVar129._8_4_ = auVar66._8_4_ * fVar125 + auVar82._8_4_ * auVar73._8_4_;
                  auVar129._12_4_ = auVar66._12_4_ * fVar125 + auVar82._12_4_ * auVar73._12_4_;
                  auVar90 = vsubps_avx(auVar90,auVar129);
                  auVar73 = vandps_avx512vl(auVar65,auVar259._0_16_);
                  auVar65 = vprolq_avx512vl(auVar73,0x20);
                  auVar73 = vmaxss_avx(auVar65,auVar73);
                  bVar62 = (float)local_470._0_4_ < auVar73._0_4_;
                  if (auVar73._0_4_ < (float)local_470._0_4_) {
                    auVar73 = vucomiss_avx512f(auVar85);
                    if (bVar62) break;
                    auVar66 = vucomiss_avx512f(auVar73);
                    auVar267 = ZEXT1664(auVar66);
                    if (bVar62) break;
                    vmovshdup_avx(auVar73);
                    auVar85 = vucomiss_avx512f(auVar85);
                    if (bVar62) break;
                    auVar66 = vucomiss_avx512f(auVar85);
                    auVar267 = ZEXT1664(auVar66);
                    if (bVar62) break;
                    auVar65 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar84 = vinsertps_avx(auVar65,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                  [2]),0x28);
                    auVar65 = vdpps_avx(auVar84,local_4a0,0x7f);
                    auVar78 = vdpps_avx(auVar84,local_4b0,0x7f);
                    auVar79 = vdpps_avx(auVar84,local_4c0,0x7f);
                    auVar80 = vdpps_avx(auVar84,local_4d0,0x7f);
                    auVar87 = vdpps_avx(auVar84,local_4e0,0x7f);
                    auVar88 = vdpps_avx(auVar84,local_4f0,0x7f);
                    auVar83 = vdpps_avx(auVar84,local_500,0x7f);
                    auVar84 = vdpps_avx(auVar84,local_510,0x7f);
                    auVar90 = vsubss_avx512f(auVar66,auVar85);
                    fVar226 = auVar85._0_4_;
                    auVar85 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar87._0_4_)),auVar90,
                                              auVar65);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar88._0_4_ * fVar226)),auVar90,
                                              auVar78);
                    auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ * fVar226)),auVar90,
                                              auVar79);
                    auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar226 * auVar84._0_4_)),auVar90,
                                              auVar80);
                    auVar66 = vsubss_avx512f(auVar66,auVar73);
                    auVar180._0_4_ = auVar66._0_4_;
                    fVar215 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                    auVar66 = vmulss_avx512f(auVar73,auVar72);
                    fVar224 = auVar66._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                    fVar125 = auVar73._0_4_;
                    auVar174._0_4_ = fVar125 * fVar125;
                    auVar174._4_4_ = auVar73._4_4_ * auVar73._4_4_;
                    auVar174._8_4_ = auVar73._8_4_ * auVar73._8_4_;
                    auVar174._12_4_ = auVar73._12_4_ * auVar73._12_4_;
                    auVar66 = vmulss_avx512f(auVar174,auVar72);
                    fVar225 = auVar180._0_4_ * auVar66._0_4_;
                    fVar238 = fVar125 * auVar174._0_4_;
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar238 * auVar79._0_4_)),
                                              ZEXT416((uint)fVar225),auVar78);
                    auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar224),auVar65);
                    auVar85 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar215),auVar85);
                    fVar237 = auVar85._0_4_;
                    if ((fVar237 < fVar146) ||
                       (fVar239 = *(float *)(ray + k * 4 + 0x200), fVar239 < fVar237)) break;
                    auVar85 = vshufps_avx(auVar73,auVar73,0x55);
                    auVar72 = vsubps_avx512vl(auVar77,auVar85);
                    fVar240 = auVar85._0_4_;
                    auVar211._0_4_ = fVar240 * (float)local_530._0_4_;
                    fVar246 = auVar85._4_4_;
                    auVar211._4_4_ = fVar246 * (float)local_530._4_4_;
                    fVar247 = auVar85._8_4_;
                    auVar211._8_4_ = fVar247 * fStack_528;
                    fVar248 = auVar85._12_4_;
                    auVar211._12_4_ = fVar248 * fStack_524;
                    auVar223._0_4_ = fVar240 * (float)local_580._0_4_;
                    auVar223._4_4_ = fVar246 * (float)local_580._4_4_;
                    auVar223._8_4_ = fVar247 * fStack_578;
                    auVar223._12_4_ = fVar248 * fStack_574;
                    auVar235._0_4_ = fVar240 * (float)local_590._0_4_;
                    auVar235._4_4_ = fVar246 * (float)local_590._4_4_;
                    auVar235._8_4_ = fVar247 * fStack_588;
                    auVar235._12_4_ = fVar248 * fStack_584;
                    auVar191._0_4_ = fVar240 * (float)local_550._0_4_;
                    auVar191._4_4_ = fVar246 * (float)local_550._4_4_;
                    auVar191._8_4_ = fVar247 * fStack_548;
                    auVar191._12_4_ = fVar248 * fStack_544;
                    auVar85 = vfmadd231ps_fma(auVar211,auVar72,local_520);
                    auVar66 = vfmadd231ps_fma(auVar223,auVar72,local_560);
                    auVar65 = vfmadd231ps_fma(auVar235,auVar72,local_570);
                    auVar72 = vfmadd231ps_fma(auVar191,auVar72,local_540);
                    auVar85 = vsubps_avx(auVar66,auVar85);
                    auVar66 = vsubps_avx(auVar65,auVar66);
                    auVar65 = vsubps_avx(auVar72,auVar65);
                    auVar236._0_4_ = fVar125 * auVar66._0_4_;
                    auVar236._4_4_ = fVar125 * auVar66._4_4_;
                    auVar236._8_4_ = fVar125 * auVar66._8_4_;
                    auVar236._12_4_ = fVar125 * auVar66._12_4_;
                    auVar180._4_4_ = auVar180._0_4_;
                    auVar180._8_4_ = auVar180._0_4_;
                    auVar180._12_4_ = auVar180._0_4_;
                    auVar85 = vfmadd231ps_fma(auVar236,auVar180,auVar85);
                    auVar192._0_4_ = fVar125 * auVar65._0_4_;
                    auVar192._4_4_ = fVar125 * auVar65._4_4_;
                    auVar192._8_4_ = fVar125 * auVar65._8_4_;
                    auVar192._12_4_ = fVar125 * auVar65._12_4_;
                    auVar66 = vfmadd231ps_fma(auVar192,auVar180,auVar66);
                    auVar193._0_4_ = fVar125 * auVar66._0_4_;
                    auVar193._4_4_ = fVar125 * auVar66._4_4_;
                    auVar193._8_4_ = fVar125 * auVar66._8_4_;
                    auVar193._12_4_ = fVar125 * auVar66._12_4_;
                    auVar85 = vfmadd231ps_fma(auVar193,auVar180,auVar85);
                    auVar85 = vmulps_avx512vl(auVar85,auVar182);
                    pGVar7 = (context->scene->geometries).items[uVar59].ptr;
                    if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) break;
                    auVar175._0_4_ = fVar238 * (float)local_5d0._0_4_;
                    auVar175._4_4_ = fVar238 * (float)local_5d0._4_4_;
                    auVar175._8_4_ = fVar238 * fStack_5c8;
                    auVar175._12_4_ = fVar238 * fStack_5c4;
                    auVar164._4_4_ = fVar225;
                    auVar164._0_4_ = fVar225;
                    auVar164._8_4_ = fVar225;
                    auVar164._12_4_ = fVar225;
                    auVar66 = vfmadd132ps_fma(auVar164,auVar175,local_5c0);
                    auVar156._4_4_ = fVar224;
                    auVar156._0_4_ = fVar224;
                    auVar156._8_4_ = fVar224;
                    auVar156._12_4_ = fVar224;
                    auVar66 = vfmadd132ps_fma(auVar156,auVar66,local_5b0);
                    auVar150._4_4_ = fVar215;
                    auVar150._0_4_ = fVar215;
                    auVar150._8_4_ = fVar215;
                    auVar150._12_4_ = fVar215;
                    auVar72 = vfmadd132ps_fma(auVar150,auVar66,local_5a0);
                    auVar66 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar65 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar151._0_4_ = auVar72._0_4_ * auVar65._0_4_;
                    auVar151._4_4_ = auVar72._4_4_ * auVar65._4_4_;
                    auVar151._8_4_ = auVar72._8_4_ * auVar65._8_4_;
                    auVar151._12_4_ = auVar72._12_4_ * auVar65._12_4_;
                    auVar85 = vfmsub231ps_fma(auVar151,auVar85,auVar66);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar237;
                      uVar135 = vextractps_avx(auVar85,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar135;
                      uVar135 = vextractps_avx(auVar85,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar135;
                      *(int *)(ray + k * 4 + 0x380) = auVar85._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar125;
                      *(float *)(ray + k * 4 + 0x400) = fVar226;
                      *(uint *)(ray + k * 4 + 0x440) = uVar5;
                      *(uint *)(ray + k * 4 + 0x480) = uVar59;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                      break;
                    }
                    local_200 = vbroadcastss_avx512f(auVar73);
                    auVar123 = vbroadcastss_avx512f(ZEXT416(1));
                    local_1c0 = vpermps_avx512f(auVar123,ZEXT1664(auVar73));
                    auVar123 = vpermps_avx512f(auVar123,ZEXT1664(auVar85));
                    auVar265 = vbroadcastss_avx512f(ZEXT416(2));
                    local_280 = vpermps_avx512f(auVar265,ZEXT1664(auVar85));
                    local_240 = vbroadcastss_avx512f(auVar85);
                    local_2c0[0] = (RTCHitN)auVar123[0];
                    local_2c0[1] = (RTCHitN)auVar123[1];
                    local_2c0[2] = (RTCHitN)auVar123[2];
                    local_2c0[3] = (RTCHitN)auVar123[3];
                    local_2c0[4] = (RTCHitN)auVar123[4];
                    local_2c0[5] = (RTCHitN)auVar123[5];
                    local_2c0[6] = (RTCHitN)auVar123[6];
                    local_2c0[7] = (RTCHitN)auVar123[7];
                    local_2c0[8] = (RTCHitN)auVar123[8];
                    local_2c0[9] = (RTCHitN)auVar123[9];
                    local_2c0[10] = (RTCHitN)auVar123[10];
                    local_2c0[0xb] = (RTCHitN)auVar123[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar123[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar123[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar123[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar123[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar123[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar123[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar123[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar123[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar123[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar123[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar123[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar123[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar123[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar123[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar123[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar123[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar123[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar123[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar123[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar123[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar123[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar123[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar123[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar123[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar123[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar123[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar123[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar123[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar123[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar123[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar123[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar123[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar123[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar123[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar123[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar123[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar123[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar123[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar123[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar123[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar123[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar123[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar123[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar123[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar123[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar123[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar123[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar123[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar123[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar123[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar123[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar123[0x3f];
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar123 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar123);
                    vpcmpeqd_avx2(auVar123._0_32_,auVar123._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar237;
                    auVar123 = vmovdqa64_avx512f(local_380);
                    local_400 = vmovdqa64_avx512f(auVar123);
                    local_640.valid = (int *)local_400;
                    local_640.geometryUserPtr = pGVar7->userPtr;
                    local_640.context = context->user;
                    local_640.hit = local_2c0;
                    local_640.N = 0x10;
                    local_640.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar7->intersectionFilterN)(&local_640);
                      auVar267 = ZEXT464(0x3f800000);
                      auVar264 = ZEXT3264(_DAT_01feed20);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar263 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar262 = ZEXT1664(auVar73);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar261 = ZEXT3264(auVar96);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar260 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar259 = ZEXT1664(auVar73);
                      auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar130 = ZEXT1664(auVar73);
                      auVar123 = vmovdqa64_avx512f(local_400);
                    }
                    auVar113._16_48_ = auVar123._16_48_;
                    uVar22 = vptestmd_avx512f(auVar123,auVar123);
                    if ((short)uVar22 != 0) {
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var10)(&local_640);
                        auVar267 = ZEXT464(0x3f800000);
                        auVar264 = ZEXT3264(_DAT_01feed20);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar263 = ZEXT1664(auVar73);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                        auVar262 = ZEXT1664(auVar73);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar261 = ZEXT3264(auVar96);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar260 = ZEXT1664(auVar73);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar259 = ZEXT1664(auVar73);
                        auVar73 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar130 = ZEXT1664(auVar73);
                        auVar123 = vmovdqa64_avx512f(local_400);
                        auVar113._16_48_ = auVar123._16_48_;
                      }
                      uVar56 = vptestmd_avx512f(auVar123,auVar123);
                      if ((short)uVar56 != 0) {
                        iVar35 = *(int *)(local_640.hit + 4);
                        iVar36 = *(int *)(local_640.hit + 8);
                        iVar37 = *(int *)(local_640.hit + 0xc);
                        iVar38 = *(int *)(local_640.hit + 0x10);
                        iVar39 = *(int *)(local_640.hit + 0x14);
                        iVar40 = *(int *)(local_640.hit + 0x18);
                        iVar41 = *(int *)(local_640.hit + 0x1c);
                        iVar42 = *(int *)(local_640.hit + 0x20);
                        iVar43 = *(int *)(local_640.hit + 0x24);
                        iVar44 = *(int *)(local_640.hit + 0x28);
                        iVar45 = *(int *)(local_640.hit + 0x2c);
                        iVar46 = *(int *)(local_640.hit + 0x30);
                        iVar47 = *(int *)(local_640.hit + 0x34);
                        iVar48 = *(int *)(local_640.hit + 0x38);
                        iVar49 = *(int *)(local_640.hit + 0x3c);
                        bVar50 = (byte)uVar56;
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar56 >> 7) & 1);
                        bVar14 = (byte)(uVar56 >> 8);
                        bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        bVar21 = SUB81(uVar56 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x300) =
                             (uint)(bVar50 & 1) * *(int *)local_640.hit |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x300);
                        *(uint *)(local_640.ray + 0x304) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x304)
                        ;
                        *(uint *)(local_640.ray + 0x308) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x308)
                        ;
                        *(uint *)(local_640.ray + 0x30c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x30c)
                        ;
                        *(uint *)(local_640.ray + 0x310) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x310)
                        ;
                        *(uint *)(local_640.ray + 0x314) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x314)
                        ;
                        *(uint *)(local_640.ray + 0x318) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x318)
                        ;
                        *(uint *)(local_640.ray + 0x31c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x31c)
                        ;
                        *(uint *)(local_640.ray + 800) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 800);
                        *(uint *)(local_640.ray + 0x324) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x324)
                        ;
                        *(uint *)(local_640.ray + 0x328) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x328)
                        ;
                        *(uint *)(local_640.ray + 0x32c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x32c)
                        ;
                        *(uint *)(local_640.ray + 0x330) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x330)
                        ;
                        *(uint *)(local_640.ray + 0x334) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x334)
                        ;
                        *(uint *)(local_640.ray + 0x338) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x338)
                        ;
                        *(uint *)(local_640.ray + 0x33c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x33c)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x44);
                        iVar36 = *(int *)(local_640.hit + 0x48);
                        iVar37 = *(int *)(local_640.hit + 0x4c);
                        iVar38 = *(int *)(local_640.hit + 0x50);
                        iVar39 = *(int *)(local_640.hit + 0x54);
                        iVar40 = *(int *)(local_640.hit + 0x58);
                        iVar41 = *(int *)(local_640.hit + 0x5c);
                        iVar42 = *(int *)(local_640.hit + 0x60);
                        iVar43 = *(int *)(local_640.hit + 100);
                        iVar44 = *(int *)(local_640.hit + 0x68);
                        iVar45 = *(int *)(local_640.hit + 0x6c);
                        iVar46 = *(int *)(local_640.hit + 0x70);
                        iVar47 = *(int *)(local_640.hit + 0x74);
                        iVar48 = *(int *)(local_640.hit + 0x78);
                        iVar49 = *(int *)(local_640.hit + 0x7c);
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar56 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        bVar21 = SUB81(uVar56 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x340) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x40) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x340);
                        *(uint *)(local_640.ray + 0x344) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x344)
                        ;
                        *(uint *)(local_640.ray + 0x348) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x348)
                        ;
                        *(uint *)(local_640.ray + 0x34c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x34c)
                        ;
                        *(uint *)(local_640.ray + 0x350) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x350)
                        ;
                        *(uint *)(local_640.ray + 0x354) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x354)
                        ;
                        *(uint *)(local_640.ray + 0x358) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x358)
                        ;
                        *(uint *)(local_640.ray + 0x35c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x35c)
                        ;
                        *(uint *)(local_640.ray + 0x360) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x360);
                        *(uint *)(local_640.ray + 0x364) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x364)
                        ;
                        *(uint *)(local_640.ray + 0x368) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x368)
                        ;
                        *(uint *)(local_640.ray + 0x36c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x36c)
                        ;
                        *(uint *)(local_640.ray + 0x370) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x370)
                        ;
                        *(uint *)(local_640.ray + 0x374) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x374)
                        ;
                        *(uint *)(local_640.ray + 0x378) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x378)
                        ;
                        *(uint *)(local_640.ray + 0x37c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x37c)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x84);
                        iVar36 = *(int *)(local_640.hit + 0x88);
                        iVar37 = *(int *)(local_640.hit + 0x8c);
                        iVar38 = *(int *)(local_640.hit + 0x90);
                        iVar39 = *(int *)(local_640.hit + 0x94);
                        iVar40 = *(int *)(local_640.hit + 0x98);
                        iVar41 = *(int *)(local_640.hit + 0x9c);
                        iVar42 = *(int *)(local_640.hit + 0xa0);
                        iVar43 = *(int *)(local_640.hit + 0xa4);
                        iVar44 = *(int *)(local_640.hit + 0xa8);
                        iVar45 = *(int *)(local_640.hit + 0xac);
                        iVar46 = *(int *)(local_640.hit + 0xb0);
                        iVar47 = *(int *)(local_640.hit + 0xb4);
                        iVar48 = *(int *)(local_640.hit + 0xb8);
                        iVar49 = *(int *)(local_640.hit + 0xbc);
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar56 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        bVar21 = SUB81(uVar56 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x380) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x80) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x380);
                        *(uint *)(local_640.ray + 900) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 900);
                        *(uint *)(local_640.ray + 0x388) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x388)
                        ;
                        *(uint *)(local_640.ray + 0x38c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x38c)
                        ;
                        *(uint *)(local_640.ray + 0x390) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x390)
                        ;
                        *(uint *)(local_640.ray + 0x394) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x394)
                        ;
                        *(uint *)(local_640.ray + 0x398) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x398)
                        ;
                        *(uint *)(local_640.ray + 0x39c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x39c)
                        ;
                        *(uint *)(local_640.ray + 0x3a0) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x3a0);
                        *(uint *)(local_640.ray + 0x3a4) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3a4)
                        ;
                        *(uint *)(local_640.ray + 0x3a8) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x3a8)
                        ;
                        *(uint *)(local_640.ray + 0x3ac) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3ac)
                        ;
                        *(uint *)(local_640.ray + 0x3b0) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x3b0)
                        ;
                        *(uint *)(local_640.ray + 0x3b4) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3b4)
                        ;
                        *(uint *)(local_640.ray + 0x3b8) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3b8)
                        ;
                        *(uint *)(local_640.ray + 0x3bc) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3bc)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0xc4);
                        iVar36 = *(int *)(local_640.hit + 200);
                        iVar37 = *(int *)(local_640.hit + 0xcc);
                        iVar38 = *(int *)(local_640.hit + 0xd0);
                        iVar39 = *(int *)(local_640.hit + 0xd4);
                        iVar40 = *(int *)(local_640.hit + 0xd8);
                        iVar41 = *(int *)(local_640.hit + 0xdc);
                        iVar42 = *(int *)(local_640.hit + 0xe0);
                        iVar43 = *(int *)(local_640.hit + 0xe4);
                        iVar44 = *(int *)(local_640.hit + 0xe8);
                        iVar45 = *(int *)(local_640.hit + 0xec);
                        iVar46 = *(int *)(local_640.hit + 0xf0);
                        iVar47 = *(int *)(local_640.hit + 0xf4);
                        iVar48 = *(int *)(local_640.hit + 0xf8);
                        iVar49 = *(int *)(local_640.hit + 0xfc);
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar56 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        bVar21 = SUB81(uVar56 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x3c0) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0xc0) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x3c0);
                        *(uint *)(local_640.ray + 0x3c4) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x3c4)
                        ;
                        *(uint *)(local_640.ray + 0x3c8) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x3c8)
                        ;
                        *(uint *)(local_640.ray + 0x3cc) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x3cc)
                        ;
                        *(uint *)(local_640.ray + 0x3d0) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x3d0)
                        ;
                        *(uint *)(local_640.ray + 0x3d4) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x3d4)
                        ;
                        *(uint *)(local_640.ray + 0x3d8) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x3d8)
                        ;
                        *(uint *)(local_640.ray + 0x3dc) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x3dc)
                        ;
                        *(uint *)(local_640.ray + 0x3e0) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x3e0);
                        *(uint *)(local_640.ray + 0x3e4) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x3e4)
                        ;
                        *(uint *)(local_640.ray + 1000) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 1000);
                        *(uint *)(local_640.ray + 0x3ec) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x3ec)
                        ;
                        *(uint *)(local_640.ray + 0x3f0) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x3f0)
                        ;
                        *(uint *)(local_640.ray + 0x3f4) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x3f4)
                        ;
                        *(uint *)(local_640.ray + 0x3f8) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x3f8)
                        ;
                        *(uint *)(local_640.ray + 0x3fc) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x3fc)
                        ;
                        iVar35 = *(int *)(local_640.hit + 0x104);
                        iVar36 = *(int *)(local_640.hit + 0x108);
                        iVar37 = *(int *)(local_640.hit + 0x10c);
                        iVar38 = *(int *)(local_640.hit + 0x110);
                        iVar39 = *(int *)(local_640.hit + 0x114);
                        iVar40 = *(int *)(local_640.hit + 0x118);
                        iVar41 = *(int *)(local_640.hit + 0x11c);
                        iVar42 = *(int *)(local_640.hit + 0x120);
                        iVar43 = *(int *)(local_640.hit + 0x124);
                        iVar44 = *(int *)(local_640.hit + 0x128);
                        iVar45 = *(int *)(local_640.hit + 300);
                        iVar46 = *(int *)(local_640.hit + 0x130);
                        iVar47 = *(int *)(local_640.hit + 0x134);
                        iVar48 = *(int *)(local_640.hit + 0x138);
                        iVar49 = *(int *)(local_640.hit + 0x13c);
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
                        bVar60 = (bool)((byte)(uVar56 >> 3) & 1);
                        bVar61 = (bool)((byte)(uVar56 >> 4) & 1);
                        bVar11 = (bool)((byte)(uVar56 >> 5) & 1);
                        bVar12 = (bool)((byte)(uVar56 >> 6) & 1);
                        bVar13 = (bool)((byte)(uVar56 >> 7) & 1);
                        bVar15 = (bool)((byte)(uVar56 >> 9) & 1);
                        bVar16 = (bool)((byte)(uVar56 >> 10) & 1);
                        bVar17 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        bVar18 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        bVar19 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        bVar20 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        bVar21 = SUB81(uVar56 >> 0xf,0);
                        *(uint *)(local_640.ray + 0x400) =
                             (uint)(bVar50 & 1) * *(int *)(local_640.hit + 0x100) |
                             (uint)!(bool)(bVar50 & 1) * *(int *)(local_640.ray + 0x400);
                        *(uint *)(local_640.ray + 0x404) =
                             (uint)bVar62 * iVar35 | (uint)!bVar62 * *(int *)(local_640.ray + 0x404)
                        ;
                        *(uint *)(local_640.ray + 0x408) =
                             (uint)bVar63 * iVar36 | (uint)!bVar63 * *(int *)(local_640.ray + 0x408)
                        ;
                        *(uint *)(local_640.ray + 0x40c) =
                             (uint)bVar60 * iVar37 | (uint)!bVar60 * *(int *)(local_640.ray + 0x40c)
                        ;
                        *(uint *)(local_640.ray + 0x410) =
                             (uint)bVar61 * iVar38 | (uint)!bVar61 * *(int *)(local_640.ray + 0x410)
                        ;
                        *(uint *)(local_640.ray + 0x414) =
                             (uint)bVar11 * iVar39 | (uint)!bVar11 * *(int *)(local_640.ray + 0x414)
                        ;
                        *(uint *)(local_640.ray + 0x418) =
                             (uint)bVar12 * iVar40 | (uint)!bVar12 * *(int *)(local_640.ray + 0x418)
                        ;
                        *(uint *)(local_640.ray + 0x41c) =
                             (uint)bVar13 * iVar41 | (uint)!bVar13 * *(int *)(local_640.ray + 0x41c)
                        ;
                        *(uint *)(local_640.ray + 0x420) =
                             (uint)(bVar14 & 1) * iVar42 |
                             (uint)!(bool)(bVar14 & 1) * *(int *)(local_640.ray + 0x420);
                        *(uint *)(local_640.ray + 0x424) =
                             (uint)bVar15 * iVar43 | (uint)!bVar15 * *(int *)(local_640.ray + 0x424)
                        ;
                        *(uint *)(local_640.ray + 0x428) =
                             (uint)bVar16 * iVar44 | (uint)!bVar16 * *(int *)(local_640.ray + 0x428)
                        ;
                        *(uint *)(local_640.ray + 0x42c) =
                             (uint)bVar17 * iVar45 | (uint)!bVar17 * *(int *)(local_640.ray + 0x42c)
                        ;
                        *(uint *)(local_640.ray + 0x430) =
                             (uint)bVar18 * iVar46 | (uint)!bVar18 * *(int *)(local_640.ray + 0x430)
                        ;
                        *(uint *)(local_640.ray + 0x434) =
                             (uint)bVar19 * iVar47 | (uint)!bVar19 * *(int *)(local_640.ray + 0x434)
                        ;
                        *(uint *)(local_640.ray + 0x438) =
                             (uint)bVar20 * iVar48 | (uint)!bVar20 * *(int *)(local_640.ray + 0x438)
                        ;
                        *(uint *)(local_640.ray + 0x43c) =
                             (uint)bVar21 * iVar49 | (uint)!bVar21 * *(int *)(local_640.ray + 0x43c)
                        ;
                        auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x140));
                        auVar123 = vmovdqu32_avx512f(auVar123);
                        *(undefined1 (*) [64])(local_640.ray + 0x440) = auVar123;
                        auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x180));
                        auVar123 = vmovdqu32_avx512f(auVar123);
                        *(undefined1 (*) [64])(local_640.ray + 0x480) = auVar123;
                        auVar265 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x1c0));
                        auVar123 = vmovdqa32_avx512f(auVar265);
                        *(undefined1 (*) [64])(local_640.ray + 0x4c0) = auVar123;
                        auVar123 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_640.hit + 0x200));
                        bVar62 = (bool)((byte)(uVar56 >> 1) & 1);
                        auVar34._4_56_ = auVar123._8_56_;
                        auVar34._0_4_ =
                             (uint)bVar62 * auVar123._4_4_ | (uint)!bVar62 * auVar265._4_4_;
                        auVar124._0_8_ = auVar34._0_8_ << 0x20;
                        bVar62 = (bool)((byte)(uVar56 >> 2) & 1);
                        auVar124._8_4_ =
                             (uint)bVar62 * auVar123._8_4_ | (uint)!bVar62 * auVar265._8_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 3) & 1);
                        auVar124._12_4_ =
                             (uint)bVar62 * auVar123._12_4_ | (uint)!bVar62 * auVar265._12_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 4) & 1);
                        auVar124._16_4_ =
                             (uint)bVar62 * auVar123._16_4_ | (uint)!bVar62 * auVar265._16_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 5) & 1);
                        auVar124._20_4_ =
                             (uint)bVar62 * auVar123._20_4_ | (uint)!bVar62 * auVar265._20_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 6) & 1);
                        auVar124._24_4_ =
                             (uint)bVar62 * auVar123._24_4_ | (uint)!bVar62 * auVar265._24_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 7) & 1);
                        auVar124._28_4_ =
                             (uint)bVar62 * auVar123._28_4_ | (uint)!bVar62 * auVar265._28_4_;
                        auVar124._32_4_ =
                             (uint)(bVar14 & 1) * auVar123._32_4_ |
                             (uint)!(bool)(bVar14 & 1) * auVar265._32_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 9) & 1);
                        auVar124._36_4_ =
                             (uint)bVar62 * auVar123._36_4_ | (uint)!bVar62 * auVar265._36_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 10) & 1);
                        auVar124._40_4_ =
                             (uint)bVar62 * auVar123._40_4_ | (uint)!bVar62 * auVar265._40_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 0xb) & 1);
                        auVar124._44_4_ =
                             (uint)bVar62 * auVar123._44_4_ | (uint)!bVar62 * auVar265._44_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 0xc) & 1);
                        auVar124._48_4_ =
                             (uint)bVar62 * auVar123._48_4_ | (uint)!bVar62 * auVar265._48_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 0xd) & 1);
                        auVar124._52_4_ =
                             (uint)bVar62 * auVar123._52_4_ | (uint)!bVar62 * auVar265._52_4_;
                        bVar62 = (bool)((byte)(uVar56 >> 0xe) & 1);
                        auVar124._56_4_ =
                             (uint)bVar62 * auVar123._56_4_ | (uint)!bVar62 * auVar265._56_4_;
                        bVar62 = SUB81(uVar56 >> 0xf,0);
                        auVar124._60_4_ =
                             (uint)bVar62 * auVar123._60_4_ | (uint)!bVar62 * auVar265._60_4_;
                        auVar113._16_48_ = auVar124._16_48_;
                        auVar123 = vmovdqa32_avx512f(auVar123);
                        *(undefined1 (*) [64])(local_640.ray + 0x500) = auVar123;
                        break;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar239;
                    break;
                  }
                  lVar54 = lVar54 + -1;
                } while (lVar54 != 0);
              }
            }
          }
          auVar265 = ZEXT1664(local_600);
          auVar266 = ZEXT1664(local_610);
          if ((uint)uVar52 == 0) break;
        } while( true );
      }
      uVar135 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar27._4_4_ = uVar135;
      auVar27._0_4_ = uVar135;
      auVar27._8_4_ = uVar135;
      auVar27._12_4_ = uVar135;
      auVar27._16_4_ = uVar135;
      auVar27._20_4_ = uVar135;
      auVar27._24_4_ = uVar135;
      auVar27._28_4_ = uVar135;
      uVar22 = vcmpps_avx512vl(local_3c0,auVar27,2);
      uVar59 = (uint)uVar58 & local_648 & (uint)uVar22;
      uVar58 = (ulong)uVar59;
    } while (uVar59 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }